

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# transaction_tests.cpp
# Opt level: O0

void __thiscall transaction_tests::test_witness::test_method(test_witness *this)

{
  long lVar1;
  span<const_unsigned_char,_18446744073709551615UL> b;
  span<const_unsigned_char,_18446744073709551615UL> b_00;
  span<const_unsigned_char,_18446744073709551615UL> b_01;
  span<const_unsigned_char,_18446744073709551615UL> b_02;
  bool bVar2;
  undefined1 uVar3;
  reference output;
  reference this_00;
  long in_FS_OFFSET;
  SignatureData *in_stack_ffffffffffffd508;
  undefined7 in_stack_ffffffffffffd510;
  undefined1 in_stack_ffffffffffffd517;
  CTransaction *in_stack_ffffffffffffd518;
  ScriptHash *in_stack_ffffffffffffd520;
  CScript *in_stack_ffffffffffffd528;
  undefined7 in_stack_ffffffffffffd530;
  undefined1 in_stack_ffffffffffffd537;
  lazy_ostream *in_stack_ffffffffffffd538;
  element_type *in_stack_ffffffffffffd540;
  undefined7 in_stack_ffffffffffffd548;
  undefined1 in_stack_ffffffffffffd54f;
  FillableSigningProvider *in_stack_ffffffffffffd550;
  undefined8 in_stack_ffffffffffffd558;
  undefined1 *puVar4;
  CMutableTransaction *in_stack_ffffffffffffd560;
  CMutableTransaction *input;
  FillableSigningProvider *in_stack_ffffffffffffd568;
  CScript *in_stack_ffffffffffffd570;
  CMutableTransaction *tx;
  CMutableTransaction *in_stack_ffffffffffffd578;
  CMutableTransaction *input2_00;
  undefined7 in_stack_ffffffffffffd580;
  undefined1 in_stack_ffffffffffffd587;
  undefined8 in_stack_ffffffffffffd638;
  undefined1 success;
  CMutableTransaction *in_stack_ffffffffffffd640;
  CMutableTransaction *input_00;
  CTransactionRef *in_stack_ffffffffffffd648;
  CTransactionRef *output_00;
  CScript *in_stack_ffffffffffffd650;
  CScript *outscript;
  FillableSigningProvider *in_stack_ffffffffffffd658;
  FillableSigningProvider *keystore_00;
  test_witness *this_local;
  const_string local_26c0 [2];
  lazy_ostream local_26a0 [2];
  assertion_result local_2680 [2];
  undefined1 local_2648 [48];
  lazy_ostream local_2618 [2];
  assertion_result local_25f8 [3];
  const_string local_25b0 [2];
  lazy_ostream local_2590 [2];
  assertion_result local_2570 [3];
  const_string local_2528 [2];
  lazy_ostream local_2508 [2];
  assertion_result local_24e8 [2];
  CMutableTransaction input2;
  CMutableTransaction input1;
  CTransactionRef output2;
  CTransactionRef output1;
  const_string local_2420 [2];
  lazy_ostream local_2400 [2];
  assertion_result local_23e0 [2];
  const_string local_23a8 [2];
  lazy_ostream local_2388 [2];
  assertion_result local_2368 [2];
  const_string local_2330 [2];
  lazy_ostream local_2310 [2];
  assertion_result local_22f0 [2];
  const_string local_22b8 [2];
  lazy_ostream local_2298 [2];
  assertion_result local_2278 [2];
  const_string local_2240 [2];
  lazy_ostream local_2220 [2];
  assertion_result local_2200 [2];
  const_string local_21c8 [2];
  lazy_ostream local_21a8 [2];
  assertion_result local_2188 [2];
  const_string local_2150 [2];
  lazy_ostream local_2130 [2];
  assertion_result local_2110 [2];
  const_string local_20d8 [2];
  lazy_ostream local_20b8 [2];
  assertion_result local_2098 [2];
  const_string local_2060 [2];
  lazy_ostream local_2040 [2];
  assertion_result local_2020;
  undefined8 local_2000;
  const_string local_1fe8 [2];
  lazy_ostream local_1fc8 [2];
  assertion_result local_1fa8 [2];
  const_string local_1f70 [2];
  lazy_ostream local_1f50 [2];
  assertion_result local_1f30 [2];
  const_string local_1ef8 [2];
  lazy_ostream local_1ed8 [2];
  assertion_result local_1eb8 [2];
  const_string local_1e80 [2];
  lazy_ostream local_1e60 [2];
  assertion_result local_1e40 [2];
  vector<CPubKey,_std::allocator<CPubKey>_> oneandthree;
  const_string local_1d50 [2];
  lazy_ostream local_1d30 [2];
  assertion_result local_1d10 [2];
  const_string local_1cd8 [2];
  lazy_ostream local_1cb8 [2];
  assertion_result local_1c98 [2];
  const_string local_1c60 [2];
  lazy_ostream local_1c40 [2];
  assertion_result local_1c20 [2];
  const_string local_1be8 [2];
  lazy_ostream local_1bc8 [2];
  assertion_result local_1ba8 [2];
  CKey key2L;
  CKey key1L;
  CKey key3;
  CKey key2;
  CKey key1;
  undefined1 local_1778 [136];
  CMutableTransaction local_16f0 [31];
  undefined8 local_1000;
  undefined1 local_aa8 [136];
  CMutableTransaction local_a20 [2];
  CTransactionRef local_998 [8];
  CScript local_910 [4];
  FillableSigningProvider local_888 [8];
  CScript destination_script_multi;
  CScript destination_script_2L;
  CScript destination_script_1L;
  CScript destination_script_2;
  CScript destination_script_1;
  CScript scriptMulti;
  CScript scriptPubkey2L;
  CScript scriptPubkey1L;
  CScript scriptPubkey2;
  CScript scriptPubkey1;
  CPubKey pubkey2L;
  CPubKey pubkey1L;
  CPubKey pubkey3;
  CPubKey pubkey2;
  CPubKey pubkey1;
  FillableSigningProvider keystore2;
  FillableSigningProvider keystore;
  
  local_1000 = 0;
  local_2000 = 0;
  lVar1 = *(long *)(in_FS_OFFSET + 0x28);
  FillableSigningProvider::FillableSigningProvider
            ((FillableSigningProvider *)in_stack_ffffffffffffd508);
  FillableSigningProvider::FillableSigningProvider
            ((FillableSigningProvider *)in_stack_ffffffffffffd508);
  GenerateRandomKey((bool)in_stack_ffffffffffffd517);
  GenerateRandomKey((bool)in_stack_ffffffffffffd517);
  GenerateRandomKey((bool)in_stack_ffffffffffffd517);
  GenerateRandomKey((bool)in_stack_ffffffffffffd517);
  GenerateRandomKey((bool)in_stack_ffffffffffffd517);
  CKey::GetPubKey((CKey *)CONCAT17(in_stack_ffffffffffffd537,in_stack_ffffffffffffd530));
  CKey::GetPubKey((CKey *)CONCAT17(in_stack_ffffffffffffd537,in_stack_ffffffffffffd530));
  CKey::GetPubKey((CKey *)CONCAT17(in_stack_ffffffffffffd537,in_stack_ffffffffffffd530));
  CKey::GetPubKey((CKey *)CONCAT17(in_stack_ffffffffffffd537,in_stack_ffffffffffffd530));
  CKey::GetPubKey((CKey *)CONCAT17(in_stack_ffffffffffffd537,in_stack_ffffffffffffd530));
  do {
    boost::unit_test::basic_cstring<const_char>::basic_cstring<unsigned_long>
              ((basic_cstring<const_char> *)in_stack_ffffffffffffd518,
               (pointer)CONCAT17(in_stack_ffffffffffffd517,in_stack_ffffffffffffd510),
               (unsigned_long)in_stack_ffffffffffffd508);
    boost::unit_test::basic_cstring<const_char>::basic_cstring
              ((basic_cstring<const_char> *)in_stack_ffffffffffffd508);
    boost::unit_test::unit_test_log_t::set_checkpoint
              ((unit_test_log_t *)CONCAT17(in_stack_ffffffffffffd54f,in_stack_ffffffffffffd548),
               (const_string *)in_stack_ffffffffffffd540,(size_t)in_stack_ffffffffffffd538,
               (const_string *)CONCAT17(in_stack_ffffffffffffd537,in_stack_ffffffffffffd530));
    FillableSigningProvider::AddKeyPubKey
              (in_stack_ffffffffffffd550,
               (CKey *)CONCAT17(in_stack_ffffffffffffd54f,in_stack_ffffffffffffd548),
               (CPubKey *)in_stack_ffffffffffffd540);
    boost::test_tools::assertion_result::assertion_result
              ((assertion_result *)in_stack_ffffffffffffd518,(bool)in_stack_ffffffffffffd517);
    boost::unit_test::lazy_ostream::instance();
    boost::unit_test::basic_cstring<const_char>::basic_cstring<unsigned_long>
              ((basic_cstring<const_char> *)in_stack_ffffffffffffd518,
               (pointer)CONCAT17(in_stack_ffffffffffffd517,in_stack_ffffffffffffd510),
               (unsigned_long)in_stack_ffffffffffffd508);
    boost::unit_test::operator<<
              ((lazy_ostream *)CONCAT17(in_stack_ffffffffffffd517,in_stack_ffffffffffffd510),
               (basic_cstring<const_char> *)in_stack_ffffffffffffd508);
    boost::unit_test::basic_cstring<const_char>::basic_cstring<unsigned_long>
              ((basic_cstring<const_char> *)in_stack_ffffffffffffd518,
               (pointer)CONCAT17(in_stack_ffffffffffffd517,in_stack_ffffffffffffd510),
               (unsigned_long)in_stack_ffffffffffffd508);
    in_stack_ffffffffffffd508 = (SignatureData *)0x0;
    boost::test_tools::tt_detail::report_assertion
              (local_1ba8,local_1bc8,local_1be8,0x269,CHECK,CHECK_PRED);
    boost::unit_test::
    lazy_ostream_impl<boost::unit_test::lazy_ostream,_boost::unit_test::basic_cstring<const_char>,_const_boost::unit_test::basic_cstring<const_char>_&>
    ::~lazy_ostream_impl
              ((lazy_ostream_impl<boost::unit_test::lazy_ostream,_boost::unit_test::basic_cstring<const_char>,_const_boost::unit_test::basic_cstring<const_char>_&>
                *)in_stack_ffffffffffffd508);
    boost::test_tools::assertion_result::~assertion_result
              ((assertion_result *)in_stack_ffffffffffffd508);
    bVar2 = boost::test_tools::tt_detail::dummy_cond();
  } while (bVar2);
  do {
    boost::unit_test::basic_cstring<const_char>::basic_cstring<unsigned_long>
              ((basic_cstring<const_char> *)in_stack_ffffffffffffd518,
               (pointer)CONCAT17(in_stack_ffffffffffffd517,in_stack_ffffffffffffd510),
               (unsigned_long)in_stack_ffffffffffffd508);
    boost::unit_test::basic_cstring<const_char>::basic_cstring
              ((basic_cstring<const_char> *)in_stack_ffffffffffffd508);
    boost::unit_test::unit_test_log_t::set_checkpoint
              ((unit_test_log_t *)CONCAT17(in_stack_ffffffffffffd54f,in_stack_ffffffffffffd548),
               (const_string *)in_stack_ffffffffffffd540,(size_t)in_stack_ffffffffffffd538,
               (const_string *)CONCAT17(in_stack_ffffffffffffd537,in_stack_ffffffffffffd530));
    FillableSigningProvider::AddKeyPubKey
              (in_stack_ffffffffffffd550,
               (CKey *)CONCAT17(in_stack_ffffffffffffd54f,in_stack_ffffffffffffd548),
               (CPubKey *)in_stack_ffffffffffffd540);
    boost::test_tools::assertion_result::assertion_result
              ((assertion_result *)in_stack_ffffffffffffd518,(bool)in_stack_ffffffffffffd517);
    boost::unit_test::lazy_ostream::instance();
    boost::unit_test::basic_cstring<const_char>::basic_cstring<unsigned_long>
              ((basic_cstring<const_char> *)in_stack_ffffffffffffd518,
               (pointer)CONCAT17(in_stack_ffffffffffffd517,in_stack_ffffffffffffd510),
               (unsigned_long)in_stack_ffffffffffffd508);
    boost::unit_test::operator<<
              ((lazy_ostream *)CONCAT17(in_stack_ffffffffffffd517,in_stack_ffffffffffffd510),
               (basic_cstring<const_char> *)in_stack_ffffffffffffd508);
    boost::unit_test::basic_cstring<const_char>::basic_cstring<unsigned_long>
              ((basic_cstring<const_char> *)in_stack_ffffffffffffd518,
               (pointer)CONCAT17(in_stack_ffffffffffffd517,in_stack_ffffffffffffd510),
               (unsigned_long)in_stack_ffffffffffffd508);
    in_stack_ffffffffffffd508 = (SignatureData *)0x0;
    boost::test_tools::tt_detail::report_assertion
              (local_1c20,local_1c40,local_1c60,0x26a,CHECK,CHECK_PRED);
    boost::unit_test::
    lazy_ostream_impl<boost::unit_test::lazy_ostream,_boost::unit_test::basic_cstring<const_char>,_const_boost::unit_test::basic_cstring<const_char>_&>
    ::~lazy_ostream_impl
              ((lazy_ostream_impl<boost::unit_test::lazy_ostream,_boost::unit_test::basic_cstring<const_char>,_const_boost::unit_test::basic_cstring<const_char>_&>
                *)in_stack_ffffffffffffd508);
    boost::test_tools::assertion_result::~assertion_result
              ((assertion_result *)in_stack_ffffffffffffd508);
    bVar2 = boost::test_tools::tt_detail::dummy_cond();
  } while (bVar2);
  do {
    boost::unit_test::basic_cstring<const_char>::basic_cstring<unsigned_long>
              ((basic_cstring<const_char> *)in_stack_ffffffffffffd518,
               (pointer)CONCAT17(in_stack_ffffffffffffd517,in_stack_ffffffffffffd510),
               (unsigned_long)in_stack_ffffffffffffd508);
    boost::unit_test::basic_cstring<const_char>::basic_cstring
              ((basic_cstring<const_char> *)in_stack_ffffffffffffd508);
    boost::unit_test::unit_test_log_t::set_checkpoint
              ((unit_test_log_t *)CONCAT17(in_stack_ffffffffffffd54f,in_stack_ffffffffffffd548),
               (const_string *)in_stack_ffffffffffffd540,(size_t)in_stack_ffffffffffffd538,
               (const_string *)CONCAT17(in_stack_ffffffffffffd537,in_stack_ffffffffffffd530));
    FillableSigningProvider::AddKeyPubKey
              (in_stack_ffffffffffffd550,
               (CKey *)CONCAT17(in_stack_ffffffffffffd54f,in_stack_ffffffffffffd548),
               (CPubKey *)in_stack_ffffffffffffd540);
    boost::test_tools::assertion_result::assertion_result
              ((assertion_result *)in_stack_ffffffffffffd518,(bool)in_stack_ffffffffffffd517);
    boost::unit_test::lazy_ostream::instance();
    boost::unit_test::basic_cstring<const_char>::basic_cstring<unsigned_long>
              ((basic_cstring<const_char> *)in_stack_ffffffffffffd518,
               (pointer)CONCAT17(in_stack_ffffffffffffd517,in_stack_ffffffffffffd510),
               (unsigned_long)in_stack_ffffffffffffd508);
    boost::unit_test::operator<<
              ((lazy_ostream *)CONCAT17(in_stack_ffffffffffffd517,in_stack_ffffffffffffd510),
               (basic_cstring<const_char> *)in_stack_ffffffffffffd508);
    boost::unit_test::basic_cstring<const_char>::basic_cstring<unsigned_long>
              ((basic_cstring<const_char> *)in_stack_ffffffffffffd518,
               (pointer)CONCAT17(in_stack_ffffffffffffd517,in_stack_ffffffffffffd510),
               (unsigned_long)in_stack_ffffffffffffd508);
    in_stack_ffffffffffffd508 = (SignatureData *)0x0;
    boost::test_tools::tt_detail::report_assertion
              (local_1c98,local_1cb8,local_1cd8,0x26b,CHECK,CHECK_PRED);
    boost::unit_test::
    lazy_ostream_impl<boost::unit_test::lazy_ostream,_boost::unit_test::basic_cstring<const_char>,_const_boost::unit_test::basic_cstring<const_char>_&>
    ::~lazy_ostream_impl
              ((lazy_ostream_impl<boost::unit_test::lazy_ostream,_boost::unit_test::basic_cstring<const_char>,_const_boost::unit_test::basic_cstring<const_char>_&>
                *)in_stack_ffffffffffffd508);
    boost::test_tools::assertion_result::~assertion_result
              ((assertion_result *)in_stack_ffffffffffffd508);
    bVar2 = boost::test_tools::tt_detail::dummy_cond();
  } while (bVar2);
  do {
    boost::unit_test::basic_cstring<const_char>::basic_cstring<unsigned_long>
              ((basic_cstring<const_char> *)in_stack_ffffffffffffd518,
               (pointer)CONCAT17(in_stack_ffffffffffffd517,in_stack_ffffffffffffd510),
               (unsigned_long)in_stack_ffffffffffffd508);
    boost::unit_test::basic_cstring<const_char>::basic_cstring
              ((basic_cstring<const_char> *)in_stack_ffffffffffffd508);
    boost::unit_test::unit_test_log_t::set_checkpoint
              ((unit_test_log_t *)CONCAT17(in_stack_ffffffffffffd54f,in_stack_ffffffffffffd548),
               (const_string *)in_stack_ffffffffffffd540,(size_t)in_stack_ffffffffffffd538,
               (const_string *)CONCAT17(in_stack_ffffffffffffd537,in_stack_ffffffffffffd530));
    FillableSigningProvider::AddKeyPubKey
              (in_stack_ffffffffffffd550,
               (CKey *)CONCAT17(in_stack_ffffffffffffd54f,in_stack_ffffffffffffd548),
               (CPubKey *)in_stack_ffffffffffffd540);
    boost::test_tools::assertion_result::assertion_result
              ((assertion_result *)in_stack_ffffffffffffd518,(bool)in_stack_ffffffffffffd517);
    boost::unit_test::lazy_ostream::instance();
    boost::unit_test::basic_cstring<const_char>::basic_cstring<unsigned_long>
              ((basic_cstring<const_char> *)in_stack_ffffffffffffd518,
               (pointer)CONCAT17(in_stack_ffffffffffffd517,in_stack_ffffffffffffd510),
               (unsigned_long)in_stack_ffffffffffffd508);
    boost::unit_test::operator<<
              ((lazy_ostream *)CONCAT17(in_stack_ffffffffffffd517,in_stack_ffffffffffffd510),
               (basic_cstring<const_char> *)in_stack_ffffffffffffd508);
    boost::unit_test::basic_cstring<const_char>::basic_cstring<unsigned_long>
              ((basic_cstring<const_char> *)in_stack_ffffffffffffd518,
               (pointer)CONCAT17(in_stack_ffffffffffffd517,in_stack_ffffffffffffd510),
               (unsigned_long)in_stack_ffffffffffffd508);
    in_stack_ffffffffffffd508 = (SignatureData *)0x0;
    boost::test_tools::tt_detail::report_assertion
              (local_1d10,local_1d30,local_1d50,0x26c,CHECK,CHECK_PRED);
    boost::unit_test::
    lazy_ostream_impl<boost::unit_test::lazy_ostream,_boost::unit_test::basic_cstring<const_char>,_const_boost::unit_test::basic_cstring<const_char>_&>
    ::~lazy_ostream_impl
              ((lazy_ostream_impl<boost::unit_test::lazy_ostream,_boost::unit_test::basic_cstring<const_char>,_const_boost::unit_test::basic_cstring<const_char>_&>
                *)in_stack_ffffffffffffd508);
    boost::test_tools::assertion_result::~assertion_result
              ((assertion_result *)in_stack_ffffffffffffd508);
    bVar2 = boost::test_tools::tt_detail::dummy_cond();
  } while (bVar2);
  CScript::CScript((CScript *)in_stack_ffffffffffffd508);
  CScript::CScript((CScript *)in_stack_ffffffffffffd508);
  CScript::CScript((CScript *)in_stack_ffffffffffffd508);
  CScript::CScript((CScript *)in_stack_ffffffffffffd508);
  CScript::CScript((CScript *)in_stack_ffffffffffffd508);
  ToByteVector<CPubKey>((CPubKey *)CONCAT17(in_stack_ffffffffffffd54f,in_stack_ffffffffffffd548));
  std::span<const_unsigned_char,_18446744073709551615UL>::
  span<std::vector<unsigned_char,_std::allocator<unsigned_char>_>_>
            ((span<const_unsigned_char,_18446744073709551615UL> *)in_stack_ffffffffffffd518,
             (vector<unsigned_char,_std::allocator<unsigned_char>_> *)
             CONCAT17(in_stack_ffffffffffffd517,in_stack_ffffffffffffd510));
  b._M_extent._M_extent_value._0_7_ = in_stack_ffffffffffffd548;
  b._M_ptr = (pointer)in_stack_ffffffffffffd540;
  b._M_extent._M_extent_value._7_1_ = in_stack_ffffffffffffd54f;
  CScript::operator<<(in_stack_ffffffffffffd528,b);
  CScript::operator<<((CScript *)in_stack_ffffffffffffd540,
                      (opcodetype)((ulong)in_stack_ffffffffffffd538 >> 0x20));
  std::vector<unsigned_char,_std::allocator<unsigned_char>_>::~vector
            ((vector<unsigned_char,_std::allocator<unsigned_char>_> *)in_stack_ffffffffffffd518);
  ToByteVector<CPubKey>((CPubKey *)CONCAT17(in_stack_ffffffffffffd54f,in_stack_ffffffffffffd548));
  std::span<const_unsigned_char,_18446744073709551615UL>::
  span<std::vector<unsigned_char,_std::allocator<unsigned_char>_>_>
            ((span<const_unsigned_char,_18446744073709551615UL> *)in_stack_ffffffffffffd518,
             (vector<unsigned_char,_std::allocator<unsigned_char>_> *)
             CONCAT17(in_stack_ffffffffffffd517,in_stack_ffffffffffffd510));
  b_00._M_extent._M_extent_value._0_7_ = in_stack_ffffffffffffd548;
  b_00._M_ptr = (pointer)in_stack_ffffffffffffd540;
  b_00._M_extent._M_extent_value._7_1_ = in_stack_ffffffffffffd54f;
  CScript::operator<<(in_stack_ffffffffffffd528,b_00);
  CScript::operator<<((CScript *)in_stack_ffffffffffffd540,
                      (opcodetype)((ulong)in_stack_ffffffffffffd538 >> 0x20));
  std::vector<unsigned_char,_std::allocator<unsigned_char>_>::~vector
            ((vector<unsigned_char,_std::allocator<unsigned_char>_> *)in_stack_ffffffffffffd518);
  ToByteVector<CPubKey>((CPubKey *)CONCAT17(in_stack_ffffffffffffd54f,in_stack_ffffffffffffd548));
  std::span<const_unsigned_char,_18446744073709551615UL>::
  span<std::vector<unsigned_char,_std::allocator<unsigned_char>_>_>
            ((span<const_unsigned_char,_18446744073709551615UL> *)in_stack_ffffffffffffd518,
             (vector<unsigned_char,_std::allocator<unsigned_char>_> *)
             CONCAT17(in_stack_ffffffffffffd517,in_stack_ffffffffffffd510));
  b_01._M_extent._M_extent_value._0_7_ = in_stack_ffffffffffffd548;
  b_01._M_ptr = (pointer)in_stack_ffffffffffffd540;
  b_01._M_extent._M_extent_value._7_1_ = in_stack_ffffffffffffd54f;
  CScript::operator<<(in_stack_ffffffffffffd528,b_01);
  CScript::operator<<((CScript *)in_stack_ffffffffffffd540,
                      (opcodetype)((ulong)in_stack_ffffffffffffd538 >> 0x20));
  std::vector<unsigned_char,_std::allocator<unsigned_char>_>::~vector
            ((vector<unsigned_char,_std::allocator<unsigned_char>_> *)in_stack_ffffffffffffd518);
  ToByteVector<CPubKey>((CPubKey *)CONCAT17(in_stack_ffffffffffffd54f,in_stack_ffffffffffffd548));
  std::span<const_unsigned_char,_18446744073709551615UL>::
  span<std::vector<unsigned_char,_std::allocator<unsigned_char>_>_>
            ((span<const_unsigned_char,_18446744073709551615UL> *)in_stack_ffffffffffffd518,
             (vector<unsigned_char,_std::allocator<unsigned_char>_> *)
             CONCAT17(in_stack_ffffffffffffd517,in_stack_ffffffffffffd510));
  b_02._M_extent._M_extent_value._0_7_ = in_stack_ffffffffffffd548;
  b_02._M_ptr = (pointer)in_stack_ffffffffffffd540;
  b_02._M_extent._M_extent_value._7_1_ = in_stack_ffffffffffffd54f;
  CScript::operator<<(in_stack_ffffffffffffd528,b_02);
  CScript::operator<<((CScript *)in_stack_ffffffffffffd540,
                      (opcodetype)((ulong)in_stack_ffffffffffffd538 >> 0x20));
  std::vector<unsigned_char,_std::allocator<unsigned_char>_>::~vector
            ((vector<unsigned_char,_std::allocator<unsigned_char>_> *)in_stack_ffffffffffffd518);
  std::vector<CPubKey,_std::allocator<CPubKey>_>::vector
            ((vector<CPubKey,_std::allocator<CPubKey>_> *)in_stack_ffffffffffffd508);
  std::vector<CPubKey,_std::allocator<CPubKey>_>::push_back
            ((vector<CPubKey,_std::allocator<CPubKey>_> *)in_stack_ffffffffffffd518,
             (value_type *)CONCAT17(in_stack_ffffffffffffd517,in_stack_ffffffffffffd510));
  std::vector<CPubKey,_std::allocator<CPubKey>_>::push_back
            ((vector<CPubKey,_std::allocator<CPubKey>_> *)in_stack_ffffffffffffd518,
             (value_type *)CONCAT17(in_stack_ffffffffffffd517,in_stack_ffffffffffffd510));
  GetScriptForMultisig
            ((int)((ulong)in_stack_ffffffffffffd558 >> 0x20),
             (vector<CPubKey,_std::allocator<CPubKey>_> *)in_stack_ffffffffffffd550);
  CScript::operator=((CScript *)in_stack_ffffffffffffd518,
                     (CScript *)CONCAT17(in_stack_ffffffffffffd517,in_stack_ffffffffffffd510));
  CScript::~CScript((CScript *)in_stack_ffffffffffffd508);
  do {
    boost::unit_test::basic_cstring<const_char>::basic_cstring<unsigned_long>
              ((basic_cstring<const_char> *)in_stack_ffffffffffffd518,
               (pointer)CONCAT17(in_stack_ffffffffffffd517,in_stack_ffffffffffffd510),
               (unsigned_long)in_stack_ffffffffffffd508);
    boost::unit_test::basic_cstring<const_char>::basic_cstring
              ((basic_cstring<const_char> *)in_stack_ffffffffffffd508);
    boost::unit_test::unit_test_log_t::set_checkpoint
              ((unit_test_log_t *)CONCAT17(in_stack_ffffffffffffd54f,in_stack_ffffffffffffd548),
               (const_string *)in_stack_ffffffffffffd540,(size_t)in_stack_ffffffffffffd538,
               (const_string *)CONCAT17(in_stack_ffffffffffffd537,in_stack_ffffffffffffd530));
    FillableSigningProvider::AddCScript
              (in_stack_ffffffffffffd568,(CScript *)in_stack_ffffffffffffd560);
    boost::test_tools::assertion_result::assertion_result
              ((assertion_result *)in_stack_ffffffffffffd518,(bool)in_stack_ffffffffffffd517);
    boost::unit_test::lazy_ostream::instance();
    boost::unit_test::basic_cstring<const_char>::basic_cstring<unsigned_long>
              ((basic_cstring<const_char> *)in_stack_ffffffffffffd518,
               (pointer)CONCAT17(in_stack_ffffffffffffd517,in_stack_ffffffffffffd510),
               (unsigned_long)in_stack_ffffffffffffd508);
    boost::unit_test::operator<<
              ((lazy_ostream *)CONCAT17(in_stack_ffffffffffffd517,in_stack_ffffffffffffd510),
               (basic_cstring<const_char> *)in_stack_ffffffffffffd508);
    boost::unit_test::basic_cstring<const_char>::basic_cstring<unsigned_long>
              ((basic_cstring<const_char> *)in_stack_ffffffffffffd518,
               (pointer)CONCAT17(in_stack_ffffffffffffd517,in_stack_ffffffffffffd510),
               (unsigned_long)in_stack_ffffffffffffd508);
    in_stack_ffffffffffffd508 = (SignatureData *)0x0;
    boost::test_tools::tt_detail::report_assertion
              (local_1e40,local_1e60,local_1e80,0x276,CHECK,CHECK_PRED);
    boost::unit_test::
    lazy_ostream_impl<boost::unit_test::lazy_ostream,_boost::unit_test::basic_cstring<const_char>,_const_boost::unit_test::basic_cstring<const_char>_&>
    ::~lazy_ostream_impl
              ((lazy_ostream_impl<boost::unit_test::lazy_ostream,_boost::unit_test::basic_cstring<const_char>,_const_boost::unit_test::basic_cstring<const_char>_&>
                *)in_stack_ffffffffffffd508);
    boost::test_tools::assertion_result::~assertion_result
              ((assertion_result *)in_stack_ffffffffffffd508);
    bVar2 = boost::test_tools::tt_detail::dummy_cond();
  } while (bVar2);
  do {
    boost::unit_test::basic_cstring<const_char>::basic_cstring<unsigned_long>
              ((basic_cstring<const_char> *)in_stack_ffffffffffffd518,
               (pointer)CONCAT17(in_stack_ffffffffffffd517,in_stack_ffffffffffffd510),
               (unsigned_long)in_stack_ffffffffffffd508);
    boost::unit_test::basic_cstring<const_char>::basic_cstring
              ((basic_cstring<const_char> *)in_stack_ffffffffffffd508);
    boost::unit_test::unit_test_log_t::set_checkpoint
              ((unit_test_log_t *)CONCAT17(in_stack_ffffffffffffd54f,in_stack_ffffffffffffd548),
               (const_string *)in_stack_ffffffffffffd540,(size_t)in_stack_ffffffffffffd538,
               (const_string *)CONCAT17(in_stack_ffffffffffffd537,in_stack_ffffffffffffd530));
    FillableSigningProvider::AddCScript
              (in_stack_ffffffffffffd568,(CScript *)in_stack_ffffffffffffd560);
    boost::test_tools::assertion_result::assertion_result
              ((assertion_result *)in_stack_ffffffffffffd518,(bool)in_stack_ffffffffffffd517);
    boost::unit_test::lazy_ostream::instance();
    boost::unit_test::basic_cstring<const_char>::basic_cstring<unsigned_long>
              ((basic_cstring<const_char> *)in_stack_ffffffffffffd518,
               (pointer)CONCAT17(in_stack_ffffffffffffd517,in_stack_ffffffffffffd510),
               (unsigned_long)in_stack_ffffffffffffd508);
    boost::unit_test::operator<<
              ((lazy_ostream *)CONCAT17(in_stack_ffffffffffffd517,in_stack_ffffffffffffd510),
               (basic_cstring<const_char> *)in_stack_ffffffffffffd508);
    boost::unit_test::basic_cstring<const_char>::basic_cstring<unsigned_long>
              ((basic_cstring<const_char> *)in_stack_ffffffffffffd518,
               (pointer)CONCAT17(in_stack_ffffffffffffd517,in_stack_ffffffffffffd510),
               (unsigned_long)in_stack_ffffffffffffd508);
    in_stack_ffffffffffffd508 = (SignatureData *)0x0;
    boost::test_tools::tt_detail::report_assertion
              (local_1eb8,local_1ed8,local_1ef8,0x277,CHECK,CHECK_PRED);
    boost::unit_test::
    lazy_ostream_impl<boost::unit_test::lazy_ostream,_boost::unit_test::basic_cstring<const_char>,_const_boost::unit_test::basic_cstring<const_char>_&>
    ::~lazy_ostream_impl
              ((lazy_ostream_impl<boost::unit_test::lazy_ostream,_boost::unit_test::basic_cstring<const_char>,_const_boost::unit_test::basic_cstring<const_char>_&>
                *)in_stack_ffffffffffffd508);
    boost::test_tools::assertion_result::~assertion_result
              ((assertion_result *)in_stack_ffffffffffffd508);
    bVar2 = boost::test_tools::tt_detail::dummy_cond();
  } while (bVar2);
  do {
    boost::unit_test::basic_cstring<const_char>::basic_cstring<unsigned_long>
              ((basic_cstring<const_char> *)in_stack_ffffffffffffd518,
               (pointer)CONCAT17(in_stack_ffffffffffffd517,in_stack_ffffffffffffd510),
               (unsigned_long)in_stack_ffffffffffffd508);
    boost::unit_test::basic_cstring<const_char>::basic_cstring
              ((basic_cstring<const_char> *)in_stack_ffffffffffffd508);
    boost::unit_test::unit_test_log_t::set_checkpoint
              ((unit_test_log_t *)CONCAT17(in_stack_ffffffffffffd54f,in_stack_ffffffffffffd548),
               (const_string *)in_stack_ffffffffffffd540,(size_t)in_stack_ffffffffffffd538,
               (const_string *)CONCAT17(in_stack_ffffffffffffd537,in_stack_ffffffffffffd530));
    FillableSigningProvider::AddCScript
              (in_stack_ffffffffffffd568,(CScript *)in_stack_ffffffffffffd560);
    boost::test_tools::assertion_result::assertion_result
              ((assertion_result *)in_stack_ffffffffffffd518,(bool)in_stack_ffffffffffffd517);
    boost::unit_test::lazy_ostream::instance();
    boost::unit_test::basic_cstring<const_char>::basic_cstring<unsigned_long>
              ((basic_cstring<const_char> *)in_stack_ffffffffffffd518,
               (pointer)CONCAT17(in_stack_ffffffffffffd517,in_stack_ffffffffffffd510),
               (unsigned_long)in_stack_ffffffffffffd508);
    boost::unit_test::operator<<
              ((lazy_ostream *)CONCAT17(in_stack_ffffffffffffd517,in_stack_ffffffffffffd510),
               (basic_cstring<const_char> *)in_stack_ffffffffffffd508);
    boost::unit_test::basic_cstring<const_char>::basic_cstring<unsigned_long>
              ((basic_cstring<const_char> *)in_stack_ffffffffffffd518,
               (pointer)CONCAT17(in_stack_ffffffffffffd517,in_stack_ffffffffffffd510),
               (unsigned_long)in_stack_ffffffffffffd508);
    in_stack_ffffffffffffd508 = (SignatureData *)0x0;
    boost::test_tools::tt_detail::report_assertion
              (local_1f30,local_1f50,local_1f70,0x278,CHECK,CHECK_PRED);
    boost::unit_test::
    lazy_ostream_impl<boost::unit_test::lazy_ostream,_boost::unit_test::basic_cstring<const_char>,_const_boost::unit_test::basic_cstring<const_char>_&>
    ::~lazy_ostream_impl
              ((lazy_ostream_impl<boost::unit_test::lazy_ostream,_boost::unit_test::basic_cstring<const_char>,_const_boost::unit_test::basic_cstring<const_char>_&>
                *)in_stack_ffffffffffffd508);
    boost::test_tools::assertion_result::~assertion_result
              ((assertion_result *)in_stack_ffffffffffffd508);
    bVar2 = boost::test_tools::tt_detail::dummy_cond();
  } while (bVar2);
  do {
    boost::unit_test::basic_cstring<const_char>::basic_cstring<unsigned_long>
              ((basic_cstring<const_char> *)in_stack_ffffffffffffd518,
               (pointer)CONCAT17(in_stack_ffffffffffffd517,in_stack_ffffffffffffd510),
               (unsigned_long)in_stack_ffffffffffffd508);
    boost::unit_test::basic_cstring<const_char>::basic_cstring
              ((basic_cstring<const_char> *)in_stack_ffffffffffffd508);
    boost::unit_test::unit_test_log_t::set_checkpoint
              ((unit_test_log_t *)CONCAT17(in_stack_ffffffffffffd54f,in_stack_ffffffffffffd548),
               (const_string *)in_stack_ffffffffffffd540,(size_t)in_stack_ffffffffffffd538,
               (const_string *)CONCAT17(in_stack_ffffffffffffd537,in_stack_ffffffffffffd530));
    FillableSigningProvider::AddCScript
              (in_stack_ffffffffffffd568,(CScript *)in_stack_ffffffffffffd560);
    boost::test_tools::assertion_result::assertion_result
              ((assertion_result *)in_stack_ffffffffffffd518,(bool)in_stack_ffffffffffffd517);
    boost::unit_test::lazy_ostream::instance();
    boost::unit_test::basic_cstring<const_char>::basic_cstring<unsigned_long>
              ((basic_cstring<const_char> *)in_stack_ffffffffffffd518,
               (pointer)CONCAT17(in_stack_ffffffffffffd517,in_stack_ffffffffffffd510),
               (unsigned_long)in_stack_ffffffffffffd508);
    boost::unit_test::operator<<
              ((lazy_ostream *)CONCAT17(in_stack_ffffffffffffd517,in_stack_ffffffffffffd510),
               (basic_cstring<const_char> *)in_stack_ffffffffffffd508);
    boost::unit_test::basic_cstring<const_char>::basic_cstring<unsigned_long>
              ((basic_cstring<const_char> *)in_stack_ffffffffffffd518,
               (pointer)CONCAT17(in_stack_ffffffffffffd517,in_stack_ffffffffffffd510),
               (unsigned_long)in_stack_ffffffffffffd508);
    in_stack_ffffffffffffd508 = (SignatureData *)0x0;
    boost::test_tools::tt_detail::report_assertion
              (local_1fa8,local_1fc8,local_1fe8,0x279,CHECK,CHECK_PRED);
    boost::unit_test::
    lazy_ostream_impl<boost::unit_test::lazy_ostream,_boost::unit_test::basic_cstring<const_char>,_const_boost::unit_test::basic_cstring<const_char>_&>
    ::~lazy_ostream_impl
              ((lazy_ostream_impl<boost::unit_test::lazy_ostream,_boost::unit_test::basic_cstring<const_char>,_const_boost::unit_test::basic_cstring<const_char>_&>
                *)in_stack_ffffffffffffd508);
    boost::test_tools::assertion_result::~assertion_result
              ((assertion_result *)in_stack_ffffffffffffd508);
    bVar2 = boost::test_tools::tt_detail::dummy_cond();
  } while (bVar2);
  do {
    boost::unit_test::basic_cstring<const_char>::basic_cstring<unsigned_long>
              ((basic_cstring<const_char> *)in_stack_ffffffffffffd518,
               (pointer)CONCAT17(in_stack_ffffffffffffd517,in_stack_ffffffffffffd510),
               (unsigned_long)in_stack_ffffffffffffd508);
    boost::unit_test::basic_cstring<const_char>::basic_cstring
              ((basic_cstring<const_char> *)in_stack_ffffffffffffd508);
    boost::unit_test::unit_test_log_t::set_checkpoint
              ((unit_test_log_t *)CONCAT17(in_stack_ffffffffffffd54f,in_stack_ffffffffffffd548),
               (const_string *)in_stack_ffffffffffffd540,(size_t)in_stack_ffffffffffffd538,
               (const_string *)CONCAT17(in_stack_ffffffffffffd537,in_stack_ffffffffffffd530));
    FillableSigningProvider::AddCScript
              (in_stack_ffffffffffffd568,(CScript *)in_stack_ffffffffffffd560);
    boost::test_tools::assertion_result::assertion_result
              ((assertion_result *)in_stack_ffffffffffffd518,(bool)in_stack_ffffffffffffd517);
    boost::unit_test::lazy_ostream::instance();
    boost::unit_test::basic_cstring<const_char>::basic_cstring<unsigned_long>
              ((basic_cstring<const_char> *)in_stack_ffffffffffffd518,
               (pointer)CONCAT17(in_stack_ffffffffffffd517,in_stack_ffffffffffffd510),
               (unsigned_long)in_stack_ffffffffffffd508);
    boost::unit_test::operator<<
              ((lazy_ostream *)CONCAT17(in_stack_ffffffffffffd517,in_stack_ffffffffffffd510),
               (basic_cstring<const_char> *)in_stack_ffffffffffffd508);
    boost::unit_test::basic_cstring<const_char>::basic_cstring<unsigned_long>
              ((basic_cstring<const_char> *)in_stack_ffffffffffffd518,
               (pointer)CONCAT17(in_stack_ffffffffffffd517,in_stack_ffffffffffffd510),
               (unsigned_long)in_stack_ffffffffffffd508);
    in_stack_ffffffffffffd508 = (SignatureData *)0x0;
    boost::test_tools::tt_detail::report_assertion
              (&local_2020,local_2040,local_2060,0x27a,CHECK,CHECK_PRED);
    boost::unit_test::
    lazy_ostream_impl<boost::unit_test::lazy_ostream,_boost::unit_test::basic_cstring<const_char>,_const_boost::unit_test::basic_cstring<const_char>_&>
    ::~lazy_ostream_impl
              ((lazy_ostream_impl<boost::unit_test::lazy_ostream,_boost::unit_test::basic_cstring<const_char>,_const_boost::unit_test::basic_cstring<const_char>_&>
                *)in_stack_ffffffffffffd508);
    boost::test_tools::assertion_result::~assertion_result
              ((assertion_result *)in_stack_ffffffffffffd508);
    bVar2 = boost::test_tools::tt_detail::dummy_cond();
  } while (bVar2);
  CScript::CScript((CScript *)in_stack_ffffffffffffd508);
  CScript::CScript((CScript *)in_stack_ffffffffffffd508);
  CScript::CScript((CScript *)in_stack_ffffffffffffd508);
  CScript::CScript((CScript *)in_stack_ffffffffffffd508);
  CScript::CScript((CScript *)in_stack_ffffffffffffd508);
  WitnessV0KeyHash::WitnessV0KeyHash
            ((WitnessV0KeyHash *)in_stack_ffffffffffffd520,(CPubKey *)in_stack_ffffffffffffd518);
  std::
  variant<CNoDestination,PubKeyDestination,PKHash,ScriptHash,WitnessV0ScriptHash,WitnessV0KeyHash,WitnessV1Taproot,PayToAnchor,WitnessUnknown>
  ::variant<WitnessV0KeyHash,void,void,WitnessV0KeyHash,void>
            ((variant<CNoDestination,_PubKeyDestination,_PKHash,_ScriptHash,_WitnessV0ScriptHash,_WitnessV0KeyHash,_WitnessV1Taproot,_PayToAnchor,_WitnessUnknown>
              *)in_stack_ffffffffffffd518,
             (WitnessV0KeyHash *)CONCAT17(in_stack_ffffffffffffd517,in_stack_ffffffffffffd510));
  GetScriptForDestination((CTxDestination *)in_stack_ffffffffffffd508);
  CScript::operator=((CScript *)in_stack_ffffffffffffd518,
                     (CScript *)CONCAT17(in_stack_ffffffffffffd517,in_stack_ffffffffffffd510));
  CScript::~CScript((CScript *)in_stack_ffffffffffffd508);
  std::
  variant<CNoDestination,_PubKeyDestination,_PKHash,_ScriptHash,_WitnessV0ScriptHash,_WitnessV0KeyHash,_WitnessV1Taproot,_PayToAnchor,_WitnessUnknown>
  ::~variant((variant<CNoDestination,_PubKeyDestination,_PKHash,_ScriptHash,_WitnessV0ScriptHash,_WitnessV0KeyHash,_WitnessV1Taproot,_PayToAnchor,_WitnessUnknown>
              *)in_stack_ffffffffffffd508);
  WitnessV0KeyHash::WitnessV0KeyHash
            ((WitnessV0KeyHash *)in_stack_ffffffffffffd520,(CPubKey *)in_stack_ffffffffffffd518);
  std::
  variant<CNoDestination,PubKeyDestination,PKHash,ScriptHash,WitnessV0ScriptHash,WitnessV0KeyHash,WitnessV1Taproot,PayToAnchor,WitnessUnknown>
  ::variant<WitnessV0KeyHash,void,void,WitnessV0KeyHash,void>
            ((variant<CNoDestination,_PubKeyDestination,_PKHash,_ScriptHash,_WitnessV0ScriptHash,_WitnessV0KeyHash,_WitnessV1Taproot,_PayToAnchor,_WitnessUnknown>
              *)in_stack_ffffffffffffd518,
             (WitnessV0KeyHash *)CONCAT17(in_stack_ffffffffffffd517,in_stack_ffffffffffffd510));
  GetScriptForDestination((CTxDestination *)in_stack_ffffffffffffd508);
  CScript::operator=((CScript *)in_stack_ffffffffffffd518,
                     (CScript *)CONCAT17(in_stack_ffffffffffffd517,in_stack_ffffffffffffd510));
  CScript::~CScript((CScript *)in_stack_ffffffffffffd508);
  std::
  variant<CNoDestination,_PubKeyDestination,_PKHash,_ScriptHash,_WitnessV0ScriptHash,_WitnessV0KeyHash,_WitnessV1Taproot,_PayToAnchor,_WitnessUnknown>
  ::~variant((variant<CNoDestination,_PubKeyDestination,_PKHash,_ScriptHash,_WitnessV0ScriptHash,_WitnessV0KeyHash,_WitnessV1Taproot,_PayToAnchor,_WitnessUnknown>
              *)in_stack_ffffffffffffd508);
  WitnessV0KeyHash::WitnessV0KeyHash
            ((WitnessV0KeyHash *)in_stack_ffffffffffffd520,(CPubKey *)in_stack_ffffffffffffd518);
  std::
  variant<CNoDestination,PubKeyDestination,PKHash,ScriptHash,WitnessV0ScriptHash,WitnessV0KeyHash,WitnessV1Taproot,PayToAnchor,WitnessUnknown>
  ::variant<WitnessV0KeyHash,void,void,WitnessV0KeyHash,void>
            ((variant<CNoDestination,_PubKeyDestination,_PKHash,_ScriptHash,_WitnessV0ScriptHash,_WitnessV0KeyHash,_WitnessV1Taproot,_PayToAnchor,_WitnessUnknown>
              *)in_stack_ffffffffffffd518,
             (WitnessV0KeyHash *)CONCAT17(in_stack_ffffffffffffd517,in_stack_ffffffffffffd510));
  GetScriptForDestination((CTxDestination *)in_stack_ffffffffffffd508);
  CScript::operator=((CScript *)in_stack_ffffffffffffd518,
                     (CScript *)CONCAT17(in_stack_ffffffffffffd517,in_stack_ffffffffffffd510));
  CScript::~CScript((CScript *)in_stack_ffffffffffffd508);
  std::
  variant<CNoDestination,_PubKeyDestination,_PKHash,_ScriptHash,_WitnessV0ScriptHash,_WitnessV0KeyHash,_WitnessV1Taproot,_PayToAnchor,_WitnessUnknown>
  ::~variant((variant<CNoDestination,_PubKeyDestination,_PKHash,_ScriptHash,_WitnessV0ScriptHash,_WitnessV0KeyHash,_WitnessV1Taproot,_PayToAnchor,_WitnessUnknown>
              *)in_stack_ffffffffffffd508);
  WitnessV0KeyHash::WitnessV0KeyHash
            ((WitnessV0KeyHash *)in_stack_ffffffffffffd520,(CPubKey *)in_stack_ffffffffffffd518);
  std::
  variant<CNoDestination,PubKeyDestination,PKHash,ScriptHash,WitnessV0ScriptHash,WitnessV0KeyHash,WitnessV1Taproot,PayToAnchor,WitnessUnknown>
  ::variant<WitnessV0KeyHash,void,void,WitnessV0KeyHash,void>
            ((variant<CNoDestination,_PubKeyDestination,_PKHash,_ScriptHash,_WitnessV0ScriptHash,_WitnessV0KeyHash,_WitnessV1Taproot,_PayToAnchor,_WitnessUnknown>
              *)in_stack_ffffffffffffd518,
             (WitnessV0KeyHash *)CONCAT17(in_stack_ffffffffffffd517,in_stack_ffffffffffffd510));
  GetScriptForDestination((CTxDestination *)in_stack_ffffffffffffd508);
  CScript::operator=((CScript *)in_stack_ffffffffffffd518,
                     (CScript *)CONCAT17(in_stack_ffffffffffffd517,in_stack_ffffffffffffd510));
  CScript::~CScript((CScript *)in_stack_ffffffffffffd508);
  std::
  variant<CNoDestination,_PubKeyDestination,_PKHash,_ScriptHash,_WitnessV0ScriptHash,_WitnessV0KeyHash,_WitnessV1Taproot,_PayToAnchor,_WitnessUnknown>
  ::~variant((variant<CNoDestination,_PubKeyDestination,_PKHash,_ScriptHash,_WitnessV0ScriptHash,_WitnessV0KeyHash,_WitnessV1Taproot,_PayToAnchor,_WitnessUnknown>
              *)in_stack_ffffffffffffd508);
  WitnessV0ScriptHash::WitnessV0ScriptHash
            ((WitnessV0ScriptHash *)CONCAT17(in_stack_ffffffffffffd537,in_stack_ffffffffffffd530),
             in_stack_ffffffffffffd528);
  std::
  variant<CNoDestination,PubKeyDestination,PKHash,ScriptHash,WitnessV0ScriptHash,WitnessV0KeyHash,WitnessV1Taproot,PayToAnchor,WitnessUnknown>
  ::variant<WitnessV0ScriptHash,void,void,WitnessV0ScriptHash,void>
            ((variant<CNoDestination,_PubKeyDestination,_PKHash,_ScriptHash,_WitnessV0ScriptHash,_WitnessV0KeyHash,_WitnessV1Taproot,_PayToAnchor,_WitnessUnknown>
              *)in_stack_ffffffffffffd518,
             (WitnessV0ScriptHash *)CONCAT17(in_stack_ffffffffffffd517,in_stack_ffffffffffffd510));
  GetScriptForDestination((CTxDestination *)in_stack_ffffffffffffd508);
  CScript::operator=((CScript *)in_stack_ffffffffffffd518,
                     (CScript *)CONCAT17(in_stack_ffffffffffffd517,in_stack_ffffffffffffd510));
  CScript::~CScript((CScript *)in_stack_ffffffffffffd508);
  std::
  variant<CNoDestination,_PubKeyDestination,_PKHash,_ScriptHash,_WitnessV0ScriptHash,_WitnessV0KeyHash,_WitnessV1Taproot,_PayToAnchor,_WitnessUnknown>
  ::~variant((variant<CNoDestination,_PubKeyDestination,_PKHash,_ScriptHash,_WitnessV0ScriptHash,_WitnessV0KeyHash,_WitnessV1Taproot,_PayToAnchor,_WitnessUnknown>
              *)in_stack_ffffffffffffd508);
  do {
    boost::unit_test::basic_cstring<const_char>::basic_cstring<unsigned_long>
              ((basic_cstring<const_char> *)in_stack_ffffffffffffd518,
               (pointer)CONCAT17(in_stack_ffffffffffffd517,in_stack_ffffffffffffd510),
               (unsigned_long)in_stack_ffffffffffffd508);
    boost::unit_test::basic_cstring<const_char>::basic_cstring
              ((basic_cstring<const_char> *)in_stack_ffffffffffffd508);
    boost::unit_test::unit_test_log_t::set_checkpoint
              ((unit_test_log_t *)CONCAT17(in_stack_ffffffffffffd54f,in_stack_ffffffffffffd548),
               (const_string *)in_stack_ffffffffffffd540,(size_t)in_stack_ffffffffffffd538,
               (const_string *)CONCAT17(in_stack_ffffffffffffd537,in_stack_ffffffffffffd530));
    FillableSigningProvider::AddCScript
              (in_stack_ffffffffffffd568,(CScript *)in_stack_ffffffffffffd560);
    boost::test_tools::assertion_result::assertion_result
              ((assertion_result *)in_stack_ffffffffffffd518,(bool)in_stack_ffffffffffffd517);
    boost::unit_test::lazy_ostream::instance();
    boost::unit_test::basic_cstring<const_char>::basic_cstring<unsigned_long>
              ((basic_cstring<const_char> *)in_stack_ffffffffffffd518,
               (pointer)CONCAT17(in_stack_ffffffffffffd517,in_stack_ffffffffffffd510),
               (unsigned_long)in_stack_ffffffffffffd508);
    boost::unit_test::operator<<
              ((lazy_ostream *)CONCAT17(in_stack_ffffffffffffd517,in_stack_ffffffffffffd510),
               (basic_cstring<const_char> *)in_stack_ffffffffffffd508);
    boost::unit_test::basic_cstring<const_char>::basic_cstring<unsigned_long>
              ((basic_cstring<const_char> *)in_stack_ffffffffffffd518,
               (pointer)CONCAT17(in_stack_ffffffffffffd517,in_stack_ffffffffffffd510),
               (unsigned_long)in_stack_ffffffffffffd508);
    in_stack_ffffffffffffd508 = (SignatureData *)0x0;
    boost::test_tools::tt_detail::report_assertion
              (local_2098,local_20b8,local_20d8,0x281,CHECK,CHECK_PRED);
    boost::unit_test::
    lazy_ostream_impl<boost::unit_test::lazy_ostream,_boost::unit_test::basic_cstring<const_char>,_const_boost::unit_test::basic_cstring<const_char>_&>
    ::~lazy_ostream_impl
              ((lazy_ostream_impl<boost::unit_test::lazy_ostream,_boost::unit_test::basic_cstring<const_char>,_const_boost::unit_test::basic_cstring<const_char>_&>
                *)in_stack_ffffffffffffd508);
    boost::test_tools::assertion_result::~assertion_result
              ((assertion_result *)in_stack_ffffffffffffd508);
    bVar2 = boost::test_tools::tt_detail::dummy_cond();
  } while (bVar2);
  do {
    boost::unit_test::basic_cstring<const_char>::basic_cstring<unsigned_long>
              ((basic_cstring<const_char> *)in_stack_ffffffffffffd518,
               (pointer)CONCAT17(in_stack_ffffffffffffd517,in_stack_ffffffffffffd510),
               (unsigned_long)in_stack_ffffffffffffd508);
    boost::unit_test::basic_cstring<const_char>::basic_cstring
              ((basic_cstring<const_char> *)in_stack_ffffffffffffd508);
    boost::unit_test::unit_test_log_t::set_checkpoint
              ((unit_test_log_t *)CONCAT17(in_stack_ffffffffffffd54f,in_stack_ffffffffffffd548),
               (const_string *)in_stack_ffffffffffffd540,(size_t)in_stack_ffffffffffffd538,
               (const_string *)CONCAT17(in_stack_ffffffffffffd537,in_stack_ffffffffffffd530));
    FillableSigningProvider::AddCScript
              (in_stack_ffffffffffffd568,(CScript *)in_stack_ffffffffffffd560);
    boost::test_tools::assertion_result::assertion_result
              ((assertion_result *)in_stack_ffffffffffffd518,(bool)in_stack_ffffffffffffd517);
    boost::unit_test::lazy_ostream::instance();
    boost::unit_test::basic_cstring<const_char>::basic_cstring<unsigned_long>
              ((basic_cstring<const_char> *)in_stack_ffffffffffffd518,
               (pointer)CONCAT17(in_stack_ffffffffffffd517,in_stack_ffffffffffffd510),
               (unsigned_long)in_stack_ffffffffffffd508);
    boost::unit_test::operator<<
              ((lazy_ostream *)CONCAT17(in_stack_ffffffffffffd517,in_stack_ffffffffffffd510),
               (basic_cstring<const_char> *)in_stack_ffffffffffffd508);
    boost::unit_test::basic_cstring<const_char>::basic_cstring<unsigned_long>
              ((basic_cstring<const_char> *)in_stack_ffffffffffffd518,
               (pointer)CONCAT17(in_stack_ffffffffffffd517,in_stack_ffffffffffffd510),
               (unsigned_long)in_stack_ffffffffffffd508);
    in_stack_ffffffffffffd508 = (SignatureData *)0x0;
    boost::test_tools::tt_detail::report_assertion
              (local_2110,local_2130,local_2150,0x282,CHECK,CHECK_PRED);
    boost::unit_test::
    lazy_ostream_impl<boost::unit_test::lazy_ostream,_boost::unit_test::basic_cstring<const_char>,_const_boost::unit_test::basic_cstring<const_char>_&>
    ::~lazy_ostream_impl
              ((lazy_ostream_impl<boost::unit_test::lazy_ostream,_boost::unit_test::basic_cstring<const_char>,_const_boost::unit_test::basic_cstring<const_char>_&>
                *)in_stack_ffffffffffffd508);
    boost::test_tools::assertion_result::~assertion_result
              ((assertion_result *)in_stack_ffffffffffffd508);
    bVar2 = boost::test_tools::tt_detail::dummy_cond();
  } while (bVar2);
  do {
    boost::unit_test::basic_cstring<const_char>::basic_cstring<unsigned_long>
              ((basic_cstring<const_char> *)in_stack_ffffffffffffd518,
               (pointer)CONCAT17(in_stack_ffffffffffffd517,in_stack_ffffffffffffd510),
               (unsigned_long)in_stack_ffffffffffffd508);
    boost::unit_test::basic_cstring<const_char>::basic_cstring
              ((basic_cstring<const_char> *)in_stack_ffffffffffffd508);
    boost::unit_test::unit_test_log_t::set_checkpoint
              ((unit_test_log_t *)CONCAT17(in_stack_ffffffffffffd54f,in_stack_ffffffffffffd548),
               (const_string *)in_stack_ffffffffffffd540,(size_t)in_stack_ffffffffffffd538,
               (const_string *)CONCAT17(in_stack_ffffffffffffd537,in_stack_ffffffffffffd530));
    FillableSigningProvider::AddCScript
              (in_stack_ffffffffffffd568,(CScript *)in_stack_ffffffffffffd560);
    boost::test_tools::assertion_result::assertion_result
              ((assertion_result *)in_stack_ffffffffffffd518,(bool)in_stack_ffffffffffffd517);
    boost::unit_test::lazy_ostream::instance();
    boost::unit_test::basic_cstring<const_char>::basic_cstring<unsigned_long>
              ((basic_cstring<const_char> *)in_stack_ffffffffffffd518,
               (pointer)CONCAT17(in_stack_ffffffffffffd517,in_stack_ffffffffffffd510),
               (unsigned_long)in_stack_ffffffffffffd508);
    boost::unit_test::operator<<
              ((lazy_ostream *)CONCAT17(in_stack_ffffffffffffd517,in_stack_ffffffffffffd510),
               (basic_cstring<const_char> *)in_stack_ffffffffffffd508);
    boost::unit_test::basic_cstring<const_char>::basic_cstring<unsigned_long>
              ((basic_cstring<const_char> *)in_stack_ffffffffffffd518,
               (pointer)CONCAT17(in_stack_ffffffffffffd517,in_stack_ffffffffffffd510),
               (unsigned_long)in_stack_ffffffffffffd508);
    in_stack_ffffffffffffd508 = (SignatureData *)0x0;
    boost::test_tools::tt_detail::report_assertion
              (local_2188,local_21a8,local_21c8,0x283,CHECK,CHECK_PRED);
    boost::unit_test::
    lazy_ostream_impl<boost::unit_test::lazy_ostream,_boost::unit_test::basic_cstring<const_char>,_const_boost::unit_test::basic_cstring<const_char>_&>
    ::~lazy_ostream_impl
              ((lazy_ostream_impl<boost::unit_test::lazy_ostream,_boost::unit_test::basic_cstring<const_char>,_const_boost::unit_test::basic_cstring<const_char>_&>
                *)in_stack_ffffffffffffd508);
    boost::test_tools::assertion_result::~assertion_result
              ((assertion_result *)in_stack_ffffffffffffd508);
    bVar2 = boost::test_tools::tt_detail::dummy_cond();
  } while (bVar2);
  do {
    boost::unit_test::basic_cstring<const_char>::basic_cstring<unsigned_long>
              ((basic_cstring<const_char> *)in_stack_ffffffffffffd518,
               (pointer)CONCAT17(in_stack_ffffffffffffd517,in_stack_ffffffffffffd510),
               (unsigned_long)in_stack_ffffffffffffd508);
    boost::unit_test::basic_cstring<const_char>::basic_cstring
              ((basic_cstring<const_char> *)in_stack_ffffffffffffd508);
    boost::unit_test::unit_test_log_t::set_checkpoint
              ((unit_test_log_t *)CONCAT17(in_stack_ffffffffffffd54f,in_stack_ffffffffffffd548),
               (const_string *)in_stack_ffffffffffffd540,(size_t)in_stack_ffffffffffffd538,
               (const_string *)CONCAT17(in_stack_ffffffffffffd537,in_stack_ffffffffffffd530));
    FillableSigningProvider::AddCScript
              (in_stack_ffffffffffffd568,(CScript *)in_stack_ffffffffffffd560);
    boost::test_tools::assertion_result::assertion_result
              ((assertion_result *)in_stack_ffffffffffffd518,(bool)in_stack_ffffffffffffd517);
    boost::unit_test::lazy_ostream::instance();
    boost::unit_test::basic_cstring<const_char>::basic_cstring<unsigned_long>
              ((basic_cstring<const_char> *)in_stack_ffffffffffffd518,
               (pointer)CONCAT17(in_stack_ffffffffffffd517,in_stack_ffffffffffffd510),
               (unsigned_long)in_stack_ffffffffffffd508);
    boost::unit_test::operator<<
              ((lazy_ostream *)CONCAT17(in_stack_ffffffffffffd517,in_stack_ffffffffffffd510),
               (basic_cstring<const_char> *)in_stack_ffffffffffffd508);
    boost::unit_test::basic_cstring<const_char>::basic_cstring<unsigned_long>
              ((basic_cstring<const_char> *)in_stack_ffffffffffffd518,
               (pointer)CONCAT17(in_stack_ffffffffffffd517,in_stack_ffffffffffffd510),
               (unsigned_long)in_stack_ffffffffffffd508);
    in_stack_ffffffffffffd508 = (SignatureData *)0x0;
    boost::test_tools::tt_detail::report_assertion
              (local_2200,local_2220,local_2240,0x284,CHECK,CHECK_PRED);
    boost::unit_test::
    lazy_ostream_impl<boost::unit_test::lazy_ostream,_boost::unit_test::basic_cstring<const_char>,_const_boost::unit_test::basic_cstring<const_char>_&>
    ::~lazy_ostream_impl
              ((lazy_ostream_impl<boost::unit_test::lazy_ostream,_boost::unit_test::basic_cstring<const_char>,_const_boost::unit_test::basic_cstring<const_char>_&>
                *)in_stack_ffffffffffffd508);
    boost::test_tools::assertion_result::~assertion_result
              ((assertion_result *)in_stack_ffffffffffffd508);
    bVar2 = boost::test_tools::tt_detail::dummy_cond();
  } while (bVar2);
  do {
    boost::unit_test::basic_cstring<const_char>::basic_cstring<unsigned_long>
              ((basic_cstring<const_char> *)in_stack_ffffffffffffd518,
               (pointer)CONCAT17(in_stack_ffffffffffffd517,in_stack_ffffffffffffd510),
               (unsigned_long)in_stack_ffffffffffffd508);
    boost::unit_test::basic_cstring<const_char>::basic_cstring
              ((basic_cstring<const_char> *)in_stack_ffffffffffffd508);
    boost::unit_test::unit_test_log_t::set_checkpoint
              ((unit_test_log_t *)CONCAT17(in_stack_ffffffffffffd54f,in_stack_ffffffffffffd548),
               (const_string *)in_stack_ffffffffffffd540,(size_t)in_stack_ffffffffffffd538,
               (const_string *)CONCAT17(in_stack_ffffffffffffd537,in_stack_ffffffffffffd530));
    FillableSigningProvider::AddCScript
              (in_stack_ffffffffffffd568,(CScript *)in_stack_ffffffffffffd560);
    boost::test_tools::assertion_result::assertion_result
              ((assertion_result *)in_stack_ffffffffffffd518,(bool)in_stack_ffffffffffffd517);
    boost::unit_test::lazy_ostream::instance();
    boost::unit_test::basic_cstring<const_char>::basic_cstring<unsigned_long>
              ((basic_cstring<const_char> *)in_stack_ffffffffffffd518,
               (pointer)CONCAT17(in_stack_ffffffffffffd517,in_stack_ffffffffffffd510),
               (unsigned_long)in_stack_ffffffffffffd508);
    boost::unit_test::operator<<
              ((lazy_ostream *)CONCAT17(in_stack_ffffffffffffd517,in_stack_ffffffffffffd510),
               (basic_cstring<const_char> *)in_stack_ffffffffffffd508);
    boost::unit_test::basic_cstring<const_char>::basic_cstring<unsigned_long>
              ((basic_cstring<const_char> *)in_stack_ffffffffffffd518,
               (pointer)CONCAT17(in_stack_ffffffffffffd517,in_stack_ffffffffffffd510),
               (unsigned_long)in_stack_ffffffffffffd508);
    in_stack_ffffffffffffd508 = (SignatureData *)0x0;
    boost::test_tools::tt_detail::report_assertion
              (local_2278,local_2298,local_22b8,0x285,CHECK,CHECK_PRED);
    boost::unit_test::
    lazy_ostream_impl<boost::unit_test::lazy_ostream,_boost::unit_test::basic_cstring<const_char>,_const_boost::unit_test::basic_cstring<const_char>_&>
    ::~lazy_ostream_impl
              ((lazy_ostream_impl<boost::unit_test::lazy_ostream,_boost::unit_test::basic_cstring<const_char>,_const_boost::unit_test::basic_cstring<const_char>_&>
                *)in_stack_ffffffffffffd508);
    boost::test_tools::assertion_result::~assertion_result
              ((assertion_result *)in_stack_ffffffffffffd508);
    bVar2 = boost::test_tools::tt_detail::dummy_cond();
  } while (bVar2);
  do {
    boost::unit_test::basic_cstring<const_char>::basic_cstring<unsigned_long>
              ((basic_cstring<const_char> *)in_stack_ffffffffffffd518,
               (pointer)CONCAT17(in_stack_ffffffffffffd517,in_stack_ffffffffffffd510),
               (unsigned_long)in_stack_ffffffffffffd508);
    boost::unit_test::basic_cstring<const_char>::basic_cstring
              ((basic_cstring<const_char> *)in_stack_ffffffffffffd508);
    boost::unit_test::unit_test_log_t::set_checkpoint
              ((unit_test_log_t *)CONCAT17(in_stack_ffffffffffffd54f,in_stack_ffffffffffffd548),
               (const_string *)in_stack_ffffffffffffd540,(size_t)in_stack_ffffffffffffd538,
               (const_string *)CONCAT17(in_stack_ffffffffffffd537,in_stack_ffffffffffffd530));
    FillableSigningProvider::AddCScript
              (in_stack_ffffffffffffd568,(CScript *)in_stack_ffffffffffffd560);
    boost::test_tools::assertion_result::assertion_result
              ((assertion_result *)in_stack_ffffffffffffd518,(bool)in_stack_ffffffffffffd517);
    boost::unit_test::lazy_ostream::instance();
    boost::unit_test::basic_cstring<const_char>::basic_cstring<unsigned_long>
              ((basic_cstring<const_char> *)in_stack_ffffffffffffd518,
               (pointer)CONCAT17(in_stack_ffffffffffffd517,in_stack_ffffffffffffd510),
               (unsigned_long)in_stack_ffffffffffffd508);
    boost::unit_test::operator<<
              ((lazy_ostream *)CONCAT17(in_stack_ffffffffffffd517,in_stack_ffffffffffffd510),
               (basic_cstring<const_char> *)in_stack_ffffffffffffd508);
    boost::unit_test::basic_cstring<const_char>::basic_cstring<unsigned_long>
              ((basic_cstring<const_char> *)in_stack_ffffffffffffd518,
               (pointer)CONCAT17(in_stack_ffffffffffffd517,in_stack_ffffffffffffd510),
               (unsigned_long)in_stack_ffffffffffffd508);
    in_stack_ffffffffffffd508 = (SignatureData *)0x0;
    boost::test_tools::tt_detail::report_assertion
              (local_22f0,local_2310,local_2330,0x286,CHECK,CHECK_PRED);
    boost::unit_test::
    lazy_ostream_impl<boost::unit_test::lazy_ostream,_boost::unit_test::basic_cstring<const_char>,_const_boost::unit_test::basic_cstring<const_char>_&>
    ::~lazy_ostream_impl
              ((lazy_ostream_impl<boost::unit_test::lazy_ostream,_boost::unit_test::basic_cstring<const_char>,_const_boost::unit_test::basic_cstring<const_char>_&>
                *)in_stack_ffffffffffffd508);
    boost::test_tools::assertion_result::~assertion_result
              ((assertion_result *)in_stack_ffffffffffffd508);
    bVar2 = boost::test_tools::tt_detail::dummy_cond();
  } while (bVar2);
  do {
    boost::unit_test::basic_cstring<const_char>::basic_cstring<unsigned_long>
              ((basic_cstring<const_char> *)in_stack_ffffffffffffd518,
               (pointer)CONCAT17(in_stack_ffffffffffffd517,in_stack_ffffffffffffd510),
               (unsigned_long)in_stack_ffffffffffffd508);
    boost::unit_test::basic_cstring<const_char>::basic_cstring
              ((basic_cstring<const_char> *)in_stack_ffffffffffffd508);
    boost::unit_test::unit_test_log_t::set_checkpoint
              ((unit_test_log_t *)CONCAT17(in_stack_ffffffffffffd54f,in_stack_ffffffffffffd548),
               (const_string *)in_stack_ffffffffffffd540,(size_t)in_stack_ffffffffffffd538,
               (const_string *)CONCAT17(in_stack_ffffffffffffd537,in_stack_ffffffffffffd530));
    FillableSigningProvider::AddCScript
              (in_stack_ffffffffffffd568,(CScript *)in_stack_ffffffffffffd560);
    boost::test_tools::assertion_result::assertion_result
              ((assertion_result *)in_stack_ffffffffffffd518,(bool)in_stack_ffffffffffffd517);
    boost::unit_test::lazy_ostream::instance();
    boost::unit_test::basic_cstring<const_char>::basic_cstring<unsigned_long>
              ((basic_cstring<const_char> *)in_stack_ffffffffffffd518,
               (pointer)CONCAT17(in_stack_ffffffffffffd517,in_stack_ffffffffffffd510),
               (unsigned_long)in_stack_ffffffffffffd508);
    boost::unit_test::operator<<
              ((lazy_ostream *)CONCAT17(in_stack_ffffffffffffd517,in_stack_ffffffffffffd510),
               (basic_cstring<const_char> *)in_stack_ffffffffffffd508);
    boost::unit_test::basic_cstring<const_char>::basic_cstring<unsigned_long>
              ((basic_cstring<const_char> *)in_stack_ffffffffffffd518,
               (pointer)CONCAT17(in_stack_ffffffffffffd517,in_stack_ffffffffffffd510),
               (unsigned_long)in_stack_ffffffffffffd508);
    in_stack_ffffffffffffd508 = (SignatureData *)0x0;
    boost::test_tools::tt_detail::report_assertion
              (local_2368,local_2388,local_23a8,0x287,CHECK,CHECK_PRED);
    boost::unit_test::
    lazy_ostream_impl<boost::unit_test::lazy_ostream,_boost::unit_test::basic_cstring<const_char>,_const_boost::unit_test::basic_cstring<const_char>_&>
    ::~lazy_ostream_impl
              ((lazy_ostream_impl<boost::unit_test::lazy_ostream,_boost::unit_test::basic_cstring<const_char>,_const_boost::unit_test::basic_cstring<const_char>_&>
                *)in_stack_ffffffffffffd508);
    boost::test_tools::assertion_result::~assertion_result
              ((assertion_result *)in_stack_ffffffffffffd508);
    bVar2 = boost::test_tools::tt_detail::dummy_cond();
  } while (bVar2);
  do {
    boost::unit_test::basic_cstring<const_char>::basic_cstring<unsigned_long>
              ((basic_cstring<const_char> *)in_stack_ffffffffffffd518,
               (pointer)CONCAT17(in_stack_ffffffffffffd517,in_stack_ffffffffffffd510),
               (unsigned_long)in_stack_ffffffffffffd508);
    boost::unit_test::basic_cstring<const_char>::basic_cstring
              ((basic_cstring<const_char> *)in_stack_ffffffffffffd508);
    boost::unit_test::unit_test_log_t::set_checkpoint
              ((unit_test_log_t *)CONCAT17(in_stack_ffffffffffffd54f,in_stack_ffffffffffffd548),
               (const_string *)in_stack_ffffffffffffd540,(size_t)in_stack_ffffffffffffd538,
               (const_string *)CONCAT17(in_stack_ffffffffffffd537,in_stack_ffffffffffffd530));
    FillableSigningProvider::AddKeyPubKey
              (in_stack_ffffffffffffd550,
               (CKey *)CONCAT17(in_stack_ffffffffffffd54f,in_stack_ffffffffffffd548),
               (CPubKey *)in_stack_ffffffffffffd540);
    boost::test_tools::assertion_result::assertion_result
              ((assertion_result *)in_stack_ffffffffffffd518,(bool)in_stack_ffffffffffffd517);
    boost::unit_test::lazy_ostream::instance();
    boost::unit_test::basic_cstring<const_char>::basic_cstring<unsigned_long>
              ((basic_cstring<const_char> *)in_stack_ffffffffffffd518,
               (pointer)CONCAT17(in_stack_ffffffffffffd517,in_stack_ffffffffffffd510),
               (unsigned_long)in_stack_ffffffffffffd508);
    boost::unit_test::operator<<
              ((lazy_ostream *)CONCAT17(in_stack_ffffffffffffd517,in_stack_ffffffffffffd510),
               (basic_cstring<const_char> *)in_stack_ffffffffffffd508);
    boost::unit_test::basic_cstring<const_char>::basic_cstring<unsigned_long>
              ((basic_cstring<const_char> *)in_stack_ffffffffffffd518,
               (pointer)CONCAT17(in_stack_ffffffffffffd517,in_stack_ffffffffffffd510),
               (unsigned_long)in_stack_ffffffffffffd508);
    in_stack_ffffffffffffd508 = (SignatureData *)0x0;
    boost::test_tools::tt_detail::report_assertion
              (local_23e0,local_2400,local_2420,0x288,CHECK,CHECK_PRED);
    boost::unit_test::
    lazy_ostream_impl<boost::unit_test::lazy_ostream,_boost::unit_test::basic_cstring<const_char>,_const_boost::unit_test::basic_cstring<const_char>_&>
    ::~lazy_ostream_impl
              ((lazy_ostream_impl<boost::unit_test::lazy_ostream,_boost::unit_test::basic_cstring<const_char>,_const_boost::unit_test::basic_cstring<const_char>_&>
                *)in_stack_ffffffffffffd508);
    boost::test_tools::assertion_result::~assertion_result
              ((assertion_result *)in_stack_ffffffffffffd508);
    bVar2 = boost::test_tools::tt_detail::dummy_cond();
    uVar3 = (undefined1)((ulong)in_stack_ffffffffffffd638 >> 0x38);
  } while (bVar2);
  std::shared_ptr<const_CTransaction>::shared_ptr
            ((shared_ptr<const_CTransaction> *)in_stack_ffffffffffffd508);
  std::shared_ptr<const_CTransaction>::shared_ptr
            ((shared_ptr<const_CTransaction> *)in_stack_ffffffffffffd508);
  CMutableTransaction::CMutableTransaction((CMutableTransaction *)in_stack_ffffffffffffd508);
  CMutableTransaction::CMutableTransaction((CMutableTransaction *)in_stack_ffffffffffffd508);
  CreateCreditAndSpend
            (in_stack_ffffffffffffd658,in_stack_ffffffffffffd650,in_stack_ffffffffffffd648,
             in_stack_ffffffffffffd640,(bool)uVar3);
  CreateCreditAndSpend
            (in_stack_ffffffffffffd658,in_stack_ffffffffffffd650,in_stack_ffffffffffffd648,
             in_stack_ffffffffffffd640,(bool)uVar3);
  CheckWithFlag((CTransactionRef *)in_stack_ffffffffffffd568,in_stack_ffffffffffffd560,
                (uint32_t)((ulong)in_stack_ffffffffffffd558 >> 0x20),
                SUB81((ulong)in_stack_ffffffffffffd558 >> 0x18,0));
  CheckWithFlag((CTransactionRef *)in_stack_ffffffffffffd568,in_stack_ffffffffffffd560,
                (uint32_t)((ulong)in_stack_ffffffffffffd558 >> 0x20),
                SUB81((ulong)in_stack_ffffffffffffd558 >> 0x18,0));
  CheckWithFlag((CTransactionRef *)in_stack_ffffffffffffd568,in_stack_ffffffffffffd560,
                (uint32_t)((ulong)in_stack_ffffffffffffd558 >> 0x20),
                SUB81((ulong)in_stack_ffffffffffffd558 >> 0x18,0));
  CheckWithFlag((CTransactionRef *)in_stack_ffffffffffffd568,in_stack_ffffffffffffd560,
                (uint32_t)((ulong)in_stack_ffffffffffffd558 >> 0x20),
                SUB81((ulong)in_stack_ffffffffffffd558 >> 0x18,0));
  CheckWithFlag((CTransactionRef *)in_stack_ffffffffffffd568,in_stack_ffffffffffffd560,
                (uint32_t)((ulong)in_stack_ffffffffffffd558 >> 0x20),
                SUB81((ulong)in_stack_ffffffffffffd558 >> 0x18,0));
  CheckWithFlag((CTransactionRef *)in_stack_ffffffffffffd568,in_stack_ffffffffffffd560,
                (uint32_t)((ulong)in_stack_ffffffffffffd558 >> 0x20),
                SUB81((ulong)in_stack_ffffffffffffd558 >> 0x18,0));
  CheckWithFlag((CTransactionRef *)in_stack_ffffffffffffd568,in_stack_ffffffffffffd560,
                (uint32_t)((ulong)in_stack_ffffffffffffd558 >> 0x20),
                SUB81((ulong)in_stack_ffffffffffffd558 >> 0x18,0));
  CheckWithFlag((CTransactionRef *)in_stack_ffffffffffffd568,in_stack_ffffffffffffd560,
                (uint32_t)((ulong)in_stack_ffffffffffffd558 >> 0x20),
                SUB81((ulong)in_stack_ffffffffffffd558 >> 0x18,0));
  ScriptHash::ScriptHash(in_stack_ffffffffffffd520,(CScript *)in_stack_ffffffffffffd518);
  std::
  variant<CNoDestination,PubKeyDestination,PKHash,ScriptHash,WitnessV0ScriptHash,WitnessV0KeyHash,WitnessV1Taproot,PayToAnchor,WitnessUnknown>
  ::variant<ScriptHash,void,void,ScriptHash,void>
            ((variant<CNoDestination,_PubKeyDestination,_PKHash,_ScriptHash,_WitnessV0ScriptHash,_WitnessV0KeyHash,_WitnessV1Taproot,_PayToAnchor,_WitnessUnknown>
              *)in_stack_ffffffffffffd518,
             (ScriptHash *)CONCAT17(in_stack_ffffffffffffd517,in_stack_ffffffffffffd510));
  GetScriptForDestination((CTxDestination *)in_stack_ffffffffffffd508);
  CreateCreditAndSpend
            (in_stack_ffffffffffffd658,in_stack_ffffffffffffd650,in_stack_ffffffffffffd648,
             in_stack_ffffffffffffd640,(bool)uVar3);
  CScript::~CScript((CScript *)in_stack_ffffffffffffd508);
  std::
  variant<CNoDestination,_PubKeyDestination,_PKHash,_ScriptHash,_WitnessV0ScriptHash,_WitnessV0KeyHash,_WitnessV1Taproot,_PayToAnchor,_WitnessUnknown>
  ::~variant((variant<CNoDestination,_PubKeyDestination,_PKHash,_ScriptHash,_WitnessV0ScriptHash,_WitnessV0KeyHash,_WitnessV1Taproot,_PayToAnchor,_WitnessUnknown>
              *)in_stack_ffffffffffffd508);
  ScriptHash::ScriptHash(in_stack_ffffffffffffd520,(CScript *)in_stack_ffffffffffffd518);
  std::
  variant<CNoDestination,PubKeyDestination,PKHash,ScriptHash,WitnessV0ScriptHash,WitnessV0KeyHash,WitnessV1Taproot,PayToAnchor,WitnessUnknown>
  ::variant<ScriptHash,void,void,ScriptHash,void>
            ((variant<CNoDestination,_PubKeyDestination,_PKHash,_ScriptHash,_WitnessV0ScriptHash,_WitnessV0KeyHash,_WitnessV1Taproot,_PayToAnchor,_WitnessUnknown>
              *)in_stack_ffffffffffffd518,
             (ScriptHash *)CONCAT17(in_stack_ffffffffffffd517,in_stack_ffffffffffffd510));
  GetScriptForDestination((CTxDestination *)in_stack_ffffffffffffd508);
  CreateCreditAndSpend
            (in_stack_ffffffffffffd658,in_stack_ffffffffffffd650,in_stack_ffffffffffffd648,
             in_stack_ffffffffffffd640,(bool)uVar3);
  CScript::~CScript((CScript *)in_stack_ffffffffffffd508);
  std::
  variant<CNoDestination,_PubKeyDestination,_PKHash,_ScriptHash,_WitnessV0ScriptHash,_WitnessV0KeyHash,_WitnessV1Taproot,_PayToAnchor,_WitnessUnknown>
  ::~variant((variant<CNoDestination,_PubKeyDestination,_PKHash,_ScriptHash,_WitnessV0ScriptHash,_WitnessV0KeyHash,_WitnessV1Taproot,_PayToAnchor,_WitnessUnknown>
              *)in_stack_ffffffffffffd508);
  std::vector<CTxIn,_std::allocator<CTxIn>_>::operator[]
            (&in_stack_ffffffffffffd518->vin,
             CONCAT17(in_stack_ffffffffffffd517,in_stack_ffffffffffffd510));
  ReplaceRedeemScript((CScript *)in_stack_ffffffffffffd578,in_stack_ffffffffffffd570);
  CheckWithFlag((CTransactionRef *)in_stack_ffffffffffffd568,in_stack_ffffffffffffd560,
                (uint32_t)((ulong)in_stack_ffffffffffffd558 >> 0x20),
                SUB81((ulong)in_stack_ffffffffffffd558 >> 0x18,0));
  CheckWithFlag((CTransactionRef *)in_stack_ffffffffffffd568,in_stack_ffffffffffffd560,
                (uint32_t)((ulong)in_stack_ffffffffffffd558 >> 0x20),
                SUB81((ulong)in_stack_ffffffffffffd558 >> 0x18,0));
  CheckWithFlag((CTransactionRef *)in_stack_ffffffffffffd568,in_stack_ffffffffffffd560,
                (uint32_t)((ulong)in_stack_ffffffffffffd558 >> 0x20),
                SUB81((ulong)in_stack_ffffffffffffd558 >> 0x18,0));
  CheckWithFlag((CTransactionRef *)in_stack_ffffffffffffd568,in_stack_ffffffffffffd560,
                (uint32_t)((ulong)in_stack_ffffffffffffd558 >> 0x20),
                SUB81((ulong)in_stack_ffffffffffffd558 >> 0x18,0));
  CheckWithFlag((CTransactionRef *)in_stack_ffffffffffffd568,in_stack_ffffffffffffd560,
                (uint32_t)((ulong)in_stack_ffffffffffffd558 >> 0x20),
                SUB81((ulong)in_stack_ffffffffffffd558 >> 0x18,0));
  CheckWithFlag((CTransactionRef *)in_stack_ffffffffffffd568,in_stack_ffffffffffffd560,
                (uint32_t)((ulong)in_stack_ffffffffffffd558 >> 0x20),
                SUB81((ulong)in_stack_ffffffffffffd558 >> 0x18,0));
  CheckWithFlag((CTransactionRef *)in_stack_ffffffffffffd568,in_stack_ffffffffffffd560,
                (uint32_t)((ulong)in_stack_ffffffffffffd558 >> 0x20),
                SUB81((ulong)in_stack_ffffffffffffd558 >> 0x18,0));
  CheckWithFlag((CTransactionRef *)in_stack_ffffffffffffd568,in_stack_ffffffffffffd560,
                (uint32_t)((ulong)in_stack_ffffffffffffd558 >> 0x20),
                SUB81((ulong)in_stack_ffffffffffffd558 >> 0x18,0));
  CreateCreditAndSpend
            (in_stack_ffffffffffffd658,in_stack_ffffffffffffd650,in_stack_ffffffffffffd648,
             in_stack_ffffffffffffd640,(bool)uVar3);
  CreateCreditAndSpend
            (in_stack_ffffffffffffd658,in_stack_ffffffffffffd650,in_stack_ffffffffffffd648,
             in_stack_ffffffffffffd640,(bool)uVar3);
  CheckWithFlag((CTransactionRef *)in_stack_ffffffffffffd568,in_stack_ffffffffffffd560,
                (uint32_t)((ulong)in_stack_ffffffffffffd558 >> 0x20),
                SUB81((ulong)in_stack_ffffffffffffd558 >> 0x18,0));
  CheckWithFlag((CTransactionRef *)in_stack_ffffffffffffd568,in_stack_ffffffffffffd560,
                (uint32_t)((ulong)in_stack_ffffffffffffd558 >> 0x20),
                SUB81((ulong)in_stack_ffffffffffffd558 >> 0x18,0));
  CheckWithFlag((CTransactionRef *)in_stack_ffffffffffffd568,in_stack_ffffffffffffd560,
                (uint32_t)((ulong)in_stack_ffffffffffffd558 >> 0x20),
                SUB81((ulong)in_stack_ffffffffffffd558 >> 0x18,0));
  CheckWithFlag((CTransactionRef *)in_stack_ffffffffffffd568,in_stack_ffffffffffffd560,
                (uint32_t)((ulong)in_stack_ffffffffffffd558 >> 0x20),
                SUB81((ulong)in_stack_ffffffffffffd558 >> 0x18,0));
  CheckWithFlag((CTransactionRef *)in_stack_ffffffffffffd568,in_stack_ffffffffffffd560,
                (uint32_t)((ulong)in_stack_ffffffffffffd558 >> 0x20),
                SUB81((ulong)in_stack_ffffffffffffd558 >> 0x18,0));
  CheckWithFlag((CTransactionRef *)in_stack_ffffffffffffd568,in_stack_ffffffffffffd560,
                (uint32_t)((ulong)in_stack_ffffffffffffd558 >> 0x20),
                SUB81((ulong)in_stack_ffffffffffffd558 >> 0x18,0));
  CheckWithFlag((CTransactionRef *)in_stack_ffffffffffffd568,in_stack_ffffffffffffd560,
                (uint32_t)((ulong)in_stack_ffffffffffffd558 >> 0x20),
                SUB81((ulong)in_stack_ffffffffffffd558 >> 0x18,0));
  CheckWithFlag((CTransactionRef *)in_stack_ffffffffffffd568,in_stack_ffffffffffffd560,
                (uint32_t)((ulong)in_stack_ffffffffffffd558 >> 0x20),
                SUB81((ulong)in_stack_ffffffffffffd558 >> 0x18,0));
  ScriptHash::ScriptHash(in_stack_ffffffffffffd520,(CScript *)in_stack_ffffffffffffd518);
  std::
  variant<CNoDestination,PubKeyDestination,PKHash,ScriptHash,WitnessV0ScriptHash,WitnessV0KeyHash,WitnessV1Taproot,PayToAnchor,WitnessUnknown>
  ::variant<ScriptHash,void,void,ScriptHash,void>
            ((variant<CNoDestination,_PubKeyDestination,_PKHash,_ScriptHash,_WitnessV0ScriptHash,_WitnessV0KeyHash,_WitnessV1Taproot,_PayToAnchor,_WitnessUnknown>
              *)in_stack_ffffffffffffd518,
             (ScriptHash *)CONCAT17(in_stack_ffffffffffffd517,in_stack_ffffffffffffd510));
  GetScriptForDestination((CTxDestination *)in_stack_ffffffffffffd508);
  CreateCreditAndSpend
            (in_stack_ffffffffffffd658,in_stack_ffffffffffffd650,in_stack_ffffffffffffd648,
             in_stack_ffffffffffffd640,(bool)uVar3);
  CScript::~CScript((CScript *)in_stack_ffffffffffffd508);
  std::
  variant<CNoDestination,_PubKeyDestination,_PKHash,_ScriptHash,_WitnessV0ScriptHash,_WitnessV0KeyHash,_WitnessV1Taproot,_PayToAnchor,_WitnessUnknown>
  ::~variant((variant<CNoDestination,_PubKeyDestination,_PKHash,_ScriptHash,_WitnessV0ScriptHash,_WitnessV0KeyHash,_WitnessV1Taproot,_PayToAnchor,_WitnessUnknown>
              *)in_stack_ffffffffffffd508);
  ScriptHash::ScriptHash(in_stack_ffffffffffffd520,(CScript *)in_stack_ffffffffffffd518);
  keystore_00 = local_888;
  std::
  variant<CNoDestination,PubKeyDestination,PKHash,ScriptHash,WitnessV0ScriptHash,WitnessV0KeyHash,WitnessV1Taproot,PayToAnchor,WitnessUnknown>
  ::variant<ScriptHash,void,void,ScriptHash,void>
            ((variant<CNoDestination,_PubKeyDestination,_PKHash,_ScriptHash,_WitnessV0ScriptHash,_WitnessV0KeyHash,_WitnessV1Taproot,_PayToAnchor,_WitnessUnknown>
              *)in_stack_ffffffffffffd518,
             (ScriptHash *)CONCAT17(in_stack_ffffffffffffd517,in_stack_ffffffffffffd510));
  GetScriptForDestination((CTxDestination *)in_stack_ffffffffffffd508);
  CreateCreditAndSpend
            (keystore_00,in_stack_ffffffffffffd650,in_stack_ffffffffffffd648,
             in_stack_ffffffffffffd640,(bool)uVar3);
  CScript::~CScript((CScript *)in_stack_ffffffffffffd508);
  std::
  variant<CNoDestination,_PubKeyDestination,_PKHash,_ScriptHash,_WitnessV0ScriptHash,_WitnessV0KeyHash,_WitnessV1Taproot,_PayToAnchor,_WitnessUnknown>
  ::~variant((variant<CNoDestination,_PubKeyDestination,_PKHash,_ScriptHash,_WitnessV0ScriptHash,_WitnessV0KeyHash,_WitnessV1Taproot,_PayToAnchor,_WitnessUnknown>
              *)in_stack_ffffffffffffd508);
  std::vector<CTxIn,_std::allocator<CTxIn>_>::operator[]
            (&in_stack_ffffffffffffd518->vin,
             CONCAT17(in_stack_ffffffffffffd517,in_stack_ffffffffffffd510));
  ReplaceRedeemScript((CScript *)in_stack_ffffffffffffd578,in_stack_ffffffffffffd570);
  CheckWithFlag((CTransactionRef *)in_stack_ffffffffffffd568,in_stack_ffffffffffffd560,
                (uint32_t)((ulong)in_stack_ffffffffffffd558 >> 0x20),
                SUB81((ulong)in_stack_ffffffffffffd558 >> 0x18,0));
  CheckWithFlag((CTransactionRef *)in_stack_ffffffffffffd568,in_stack_ffffffffffffd560,
                (uint32_t)((ulong)in_stack_ffffffffffffd558 >> 0x20),
                SUB81((ulong)in_stack_ffffffffffffd558 >> 0x18,0));
  CheckWithFlag((CTransactionRef *)in_stack_ffffffffffffd568,in_stack_ffffffffffffd560,
                (uint32_t)((ulong)in_stack_ffffffffffffd558 >> 0x20),
                SUB81((ulong)in_stack_ffffffffffffd558 >> 0x18,0));
  CheckWithFlag((CTransactionRef *)in_stack_ffffffffffffd568,in_stack_ffffffffffffd560,
                (uint32_t)((ulong)in_stack_ffffffffffffd558 >> 0x20),
                SUB81((ulong)in_stack_ffffffffffffd558 >> 0x18,0));
  CheckWithFlag((CTransactionRef *)in_stack_ffffffffffffd568,in_stack_ffffffffffffd560,
                (uint32_t)((ulong)in_stack_ffffffffffffd558 >> 0x20),
                SUB81((ulong)in_stack_ffffffffffffd558 >> 0x18,0));
  CheckWithFlag((CTransactionRef *)in_stack_ffffffffffffd568,in_stack_ffffffffffffd560,
                (uint32_t)((ulong)in_stack_ffffffffffffd558 >> 0x20),
                SUB81((ulong)in_stack_ffffffffffffd558 >> 0x18,0));
  CheckWithFlag((CTransactionRef *)in_stack_ffffffffffffd568,in_stack_ffffffffffffd560,
                (uint32_t)((ulong)in_stack_ffffffffffffd558 >> 0x20),
                SUB81((ulong)in_stack_ffffffffffffd558 >> 0x18,0));
  CheckWithFlag((CTransactionRef *)in_stack_ffffffffffffd568,in_stack_ffffffffffffd560,
                (uint32_t)((ulong)in_stack_ffffffffffffd558 >> 0x20),
                SUB81((ulong)in_stack_ffffffffffffd558 >> 0x18,0));
  CreateCreditAndSpend
            (keystore_00,in_stack_ffffffffffffd650,in_stack_ffffffffffffd648,
             in_stack_ffffffffffffd640,(bool)uVar3);
  CreateCreditAndSpend
            (keystore_00,in_stack_ffffffffffffd650,in_stack_ffffffffffffd648,
             in_stack_ffffffffffffd640,(bool)uVar3);
  CheckWithFlag((CTransactionRef *)in_stack_ffffffffffffd568,in_stack_ffffffffffffd560,
                (uint32_t)((ulong)in_stack_ffffffffffffd558 >> 0x20),
                SUB81((ulong)in_stack_ffffffffffffd558 >> 0x18,0));
  CheckWithFlag((CTransactionRef *)in_stack_ffffffffffffd568,in_stack_ffffffffffffd560,
                (uint32_t)((ulong)in_stack_ffffffffffffd558 >> 0x20),
                SUB81((ulong)in_stack_ffffffffffffd558 >> 0x18,0));
  CheckWithFlag((CTransactionRef *)in_stack_ffffffffffffd568,in_stack_ffffffffffffd560,
                (uint32_t)((ulong)in_stack_ffffffffffffd558 >> 0x20),
                SUB81((ulong)in_stack_ffffffffffffd558 >> 0x18,0));
  CheckWithFlag((CTransactionRef *)in_stack_ffffffffffffd568,in_stack_ffffffffffffd560,
                (uint32_t)((ulong)in_stack_ffffffffffffd558 >> 0x20),
                SUB81((ulong)in_stack_ffffffffffffd558 >> 0x18,0));
  CheckWithFlag((CTransactionRef *)in_stack_ffffffffffffd568,in_stack_ffffffffffffd560,
                (uint32_t)((ulong)in_stack_ffffffffffffd558 >> 0x20),
                SUB81((ulong)in_stack_ffffffffffffd558 >> 0x18,0));
  CheckWithFlag((CTransactionRef *)in_stack_ffffffffffffd568,in_stack_ffffffffffffd560,
                (uint32_t)((ulong)in_stack_ffffffffffffd558 >> 0x20),
                SUB81((ulong)in_stack_ffffffffffffd558 >> 0x18,0));
  CheckWithFlag((CTransactionRef *)in_stack_ffffffffffffd568,in_stack_ffffffffffffd560,
                (uint32_t)((ulong)in_stack_ffffffffffffd558 >> 0x20),
                SUB81((ulong)in_stack_ffffffffffffd558 >> 0x18,0));
  CheckWithFlag((CTransactionRef *)in_stack_ffffffffffffd568,in_stack_ffffffffffffd560,
                (uint32_t)((ulong)in_stack_ffffffffffffd558 >> 0x20),
                SUB81((ulong)in_stack_ffffffffffffd558 >> 0x18,0));
  ScriptHash::ScriptHash(in_stack_ffffffffffffd520,(CScript *)in_stack_ffffffffffffd518);
  outscript = local_910;
  std::
  variant<CNoDestination,PubKeyDestination,PKHash,ScriptHash,WitnessV0ScriptHash,WitnessV0KeyHash,WitnessV1Taproot,PayToAnchor,WitnessUnknown>
  ::variant<ScriptHash,void,void,ScriptHash,void>
            ((variant<CNoDestination,_PubKeyDestination,_PKHash,_ScriptHash,_WitnessV0ScriptHash,_WitnessV0KeyHash,_WitnessV1Taproot,_PayToAnchor,_WitnessUnknown>
              *)in_stack_ffffffffffffd518,
             (ScriptHash *)CONCAT17(in_stack_ffffffffffffd517,in_stack_ffffffffffffd510));
  GetScriptForDestination((CTxDestination *)in_stack_ffffffffffffd508);
  CreateCreditAndSpend
            (keystore_00,outscript,in_stack_ffffffffffffd648,in_stack_ffffffffffffd640,(bool)uVar3);
  CScript::~CScript((CScript *)in_stack_ffffffffffffd508);
  std::
  variant<CNoDestination,_PubKeyDestination,_PKHash,_ScriptHash,_WitnessV0ScriptHash,_WitnessV0KeyHash,_WitnessV1Taproot,_PayToAnchor,_WitnessUnknown>
  ::~variant((variant<CNoDestination,_PubKeyDestination,_PKHash,_ScriptHash,_WitnessV0ScriptHash,_WitnessV0KeyHash,_WitnessV1Taproot,_PayToAnchor,_WitnessUnknown>
              *)in_stack_ffffffffffffd508);
  ScriptHash::ScriptHash(in_stack_ffffffffffffd520,(CScript *)in_stack_ffffffffffffd518);
  output_00 = local_998;
  std::
  variant<CNoDestination,PubKeyDestination,PKHash,ScriptHash,WitnessV0ScriptHash,WitnessV0KeyHash,WitnessV1Taproot,PayToAnchor,WitnessUnknown>
  ::variant<ScriptHash,void,void,ScriptHash,void>
            ((variant<CNoDestination,_PubKeyDestination,_PKHash,_ScriptHash,_WitnessV0ScriptHash,_WitnessV0KeyHash,_WitnessV1Taproot,_PayToAnchor,_WitnessUnknown>
              *)in_stack_ffffffffffffd518,
             (ScriptHash *)CONCAT17(in_stack_ffffffffffffd517,in_stack_ffffffffffffd510));
  GetScriptForDestination((CTxDestination *)in_stack_ffffffffffffd508);
  CreateCreditAndSpend(keystore_00,outscript,output_00,in_stack_ffffffffffffd640,(bool)uVar3);
  CScript::~CScript((CScript *)in_stack_ffffffffffffd508);
  std::
  variant<CNoDestination,_PubKeyDestination,_PKHash,_ScriptHash,_WitnessV0ScriptHash,_WitnessV0KeyHash,_WitnessV1Taproot,_PayToAnchor,_WitnessUnknown>
  ::~variant((variant<CNoDestination,_PubKeyDestination,_PKHash,_ScriptHash,_WitnessV0ScriptHash,_WitnessV0KeyHash,_WitnessV1Taproot,_PayToAnchor,_WitnessUnknown>
              *)in_stack_ffffffffffffd508);
  std::vector<CTxIn,_std::allocator<CTxIn>_>::operator[]
            (&in_stack_ffffffffffffd518->vin,
             CONCAT17(in_stack_ffffffffffffd517,in_stack_ffffffffffffd510));
  ReplaceRedeemScript((CScript *)in_stack_ffffffffffffd578,in_stack_ffffffffffffd570);
  CheckWithFlag((CTransactionRef *)in_stack_ffffffffffffd568,in_stack_ffffffffffffd560,
                (uint32_t)((ulong)in_stack_ffffffffffffd558 >> 0x20),
                SUB81((ulong)in_stack_ffffffffffffd558 >> 0x18,0));
  CheckWithFlag((CTransactionRef *)in_stack_ffffffffffffd568,in_stack_ffffffffffffd560,
                (uint32_t)((ulong)in_stack_ffffffffffffd558 >> 0x20),
                SUB81((ulong)in_stack_ffffffffffffd558 >> 0x18,0));
  CheckWithFlag((CTransactionRef *)in_stack_ffffffffffffd568,in_stack_ffffffffffffd560,
                (uint32_t)((ulong)in_stack_ffffffffffffd558 >> 0x20),
                SUB81((ulong)in_stack_ffffffffffffd558 >> 0x18,0));
  CheckWithFlag((CTransactionRef *)in_stack_ffffffffffffd568,in_stack_ffffffffffffd560,
                (uint32_t)((ulong)in_stack_ffffffffffffd558 >> 0x20),
                SUB81((ulong)in_stack_ffffffffffffd558 >> 0x18,0));
  CheckWithFlag((CTransactionRef *)in_stack_ffffffffffffd568,in_stack_ffffffffffffd560,
                (uint32_t)((ulong)in_stack_ffffffffffffd558 >> 0x20),
                SUB81((ulong)in_stack_ffffffffffffd558 >> 0x18,0));
  CheckWithFlag((CTransactionRef *)in_stack_ffffffffffffd568,in_stack_ffffffffffffd560,
                (uint32_t)((ulong)in_stack_ffffffffffffd558 >> 0x20),
                SUB81((ulong)in_stack_ffffffffffffd558 >> 0x18,0));
  CheckWithFlag((CTransactionRef *)in_stack_ffffffffffffd568,in_stack_ffffffffffffd560,
                (uint32_t)((ulong)in_stack_ffffffffffffd558 >> 0x20),
                SUB81((ulong)in_stack_ffffffffffffd558 >> 0x18,0));
  CheckWithFlag((CTransactionRef *)in_stack_ffffffffffffd568,in_stack_ffffffffffffd560,
                (uint32_t)((ulong)in_stack_ffffffffffffd558 >> 0x20),
                SUB81((ulong)in_stack_ffffffffffffd558 >> 0x18,0));
  CreateCreditAndSpend(keystore_00,outscript,output_00,in_stack_ffffffffffffd640,(bool)uVar3);
  CreateCreditAndSpend(keystore_00,outscript,output_00,in_stack_ffffffffffffd640,(bool)uVar3);
  ScriptHash::ScriptHash(in_stack_ffffffffffffd520,(CScript *)in_stack_ffffffffffffd518);
  input_00 = local_a20;
  std::
  variant<CNoDestination,PubKeyDestination,PKHash,ScriptHash,WitnessV0ScriptHash,WitnessV0KeyHash,WitnessV1Taproot,PayToAnchor,WitnessUnknown>
  ::variant<ScriptHash,void,void,ScriptHash,void>
            ((variant<CNoDestination,_PubKeyDestination,_PKHash,_ScriptHash,_WitnessV0ScriptHash,_WitnessV0KeyHash,_WitnessV1Taproot,_PayToAnchor,_WitnessUnknown>
              *)in_stack_ffffffffffffd518,
             (ScriptHash *)CONCAT17(in_stack_ffffffffffffd517,in_stack_ffffffffffffd510));
  GetScriptForDestination((CTxDestination *)in_stack_ffffffffffffd508);
  CreateCreditAndSpend(keystore_00,outscript,output_00,input_00,(bool)uVar3);
  CScript::~CScript((CScript *)in_stack_ffffffffffffd508);
  std::
  variant<CNoDestination,_PubKeyDestination,_PKHash,_ScriptHash,_WitnessV0ScriptHash,_WitnessV0KeyHash,_WitnessV1Taproot,_PayToAnchor,_WitnessUnknown>
  ::~variant((variant<CNoDestination,_PubKeyDestination,_PKHash,_ScriptHash,_WitnessV0ScriptHash,_WitnessV0KeyHash,_WitnessV1Taproot,_PayToAnchor,_WitnessUnknown>
              *)in_stack_ffffffffffffd508);
  ScriptHash::ScriptHash(in_stack_ffffffffffffd520,(CScript *)in_stack_ffffffffffffd518);
  puVar4 = local_aa8;
  std::
  variant<CNoDestination,PubKeyDestination,PKHash,ScriptHash,WitnessV0ScriptHash,WitnessV0KeyHash,WitnessV1Taproot,PayToAnchor,WitnessUnknown>
  ::variant<ScriptHash,void,void,ScriptHash,void>
            ((variant<CNoDestination,_PubKeyDestination,_PKHash,_ScriptHash,_WitnessV0ScriptHash,_WitnessV0KeyHash,_WitnessV1Taproot,_PayToAnchor,_WitnessUnknown>
              *)in_stack_ffffffffffffd518,
             (ScriptHash *)CONCAT17(in_stack_ffffffffffffd517,in_stack_ffffffffffffd510));
  GetScriptForDestination((CTxDestination *)in_stack_ffffffffffffd508);
  CreateCreditAndSpend(keystore_00,outscript,output_00,input_00,SUB81((ulong)puVar4 >> 0x38,0));
  CScript::~CScript((CScript *)in_stack_ffffffffffffd508);
  std::
  variant<CNoDestination,_PubKeyDestination,_PKHash,_ScriptHash,_WitnessV0ScriptHash,_WitnessV0KeyHash,_WitnessV1Taproot,_PayToAnchor,_WitnessUnknown>
  ::~variant((variant<CNoDestination,_PubKeyDestination,_PKHash,_ScriptHash,_WitnessV0ScriptHash,_WitnessV0KeyHash,_WitnessV1Taproot,_PayToAnchor,_WitnessUnknown>
              *)in_stack_ffffffffffffd508);
  CreateCreditAndSpend(keystore_00,outscript,output_00,input_00,SUB81((ulong)puVar4 >> 0x38,0));
  CheckWithFlag((CTransactionRef *)in_stack_ffffffffffffd568,in_stack_ffffffffffffd560,
                (uint32_t)((ulong)in_stack_ffffffffffffd558 >> 0x20),
                SUB81((ulong)in_stack_ffffffffffffd558 >> 0x18,0));
  CreateCreditAndSpend(keystore_00,outscript,output_00,input_00,SUB81((ulong)puVar4 >> 0x38,0));
  CheckWithFlag((CTransactionRef *)in_stack_ffffffffffffd568,in_stack_ffffffffffffd560,
                (uint32_t)((ulong)in_stack_ffffffffffffd558 >> 0x20),
                SUB81((ulong)in_stack_ffffffffffffd558 >> 0x18,0));
  do {
    boost::unit_test::basic_cstring<const_char>::basic_cstring<unsigned_long>
              ((basic_cstring<const_char> *)in_stack_ffffffffffffd518,
               (pointer)CONCAT17(in_stack_ffffffffffffd517,in_stack_ffffffffffffd510),
               (unsigned_long)in_stack_ffffffffffffd508);
    boost::unit_test::basic_cstring<const_char>::basic_cstring
              ((basic_cstring<const_char> *)in_stack_ffffffffffffd508);
    boost::unit_test::unit_test_log_t::set_checkpoint
              ((unit_test_log_t *)CONCAT17(in_stack_ffffffffffffd54f,in_stack_ffffffffffffd548),
               (const_string *)in_stack_ffffffffffffd540,(size_t)in_stack_ffffffffffffd538,
               (const_string *)CONCAT17(in_stack_ffffffffffffd537,in_stack_ffffffffffffd530));
    std::__shared_ptr_access<const_CTransaction,_(__gnu_cxx::_Lock_policy)2,_false,_false>::
    operator*((__shared_ptr_access<const_CTransaction,_(__gnu_cxx::_Lock_policy)2,_false,_false> *)
              in_stack_ffffffffffffd518);
    std::__shared_ptr_access<const_CTransaction,_(__gnu_cxx::_Lock_policy)2,_false,_false>::
    operator*((__shared_ptr_access<const_CTransaction,_(__gnu_cxx::_Lock_policy)2,_false,_false> *)
              in_stack_ffffffffffffd518);
    ::operator==(in_stack_ffffffffffffd518,
                 (CTransaction *)CONCAT17(in_stack_ffffffffffffd517,in_stack_ffffffffffffd510));
    boost::test_tools::assertion_result::assertion_result
              ((assertion_result *)in_stack_ffffffffffffd518,(bool)in_stack_ffffffffffffd517);
    boost::unit_test::lazy_ostream::instance();
    boost::unit_test::basic_cstring<const_char>::basic_cstring<unsigned_long>
              ((basic_cstring<const_char> *)in_stack_ffffffffffffd518,
               (pointer)CONCAT17(in_stack_ffffffffffffd517,in_stack_ffffffffffffd510),
               (unsigned_long)in_stack_ffffffffffffd508);
    boost::unit_test::operator<<
              ((lazy_ostream *)CONCAT17(in_stack_ffffffffffffd517,in_stack_ffffffffffffd510),
               (basic_cstring<const_char> *)in_stack_ffffffffffffd508);
    boost::unit_test::basic_cstring<const_char>::basic_cstring<unsigned_long>
              ((basic_cstring<const_char> *)in_stack_ffffffffffffd518,
               (pointer)CONCAT17(in_stack_ffffffffffffd517,in_stack_ffffffffffffd510),
               (unsigned_long)in_stack_ffffffffffffd508);
    in_stack_ffffffffffffd508 = (SignatureData *)0x0;
    boost::test_tools::tt_detail::report_assertion
              (local_24e8,local_2508,local_2528,0x2e5,CHECK,CHECK_PRED);
    boost::unit_test::
    lazy_ostream_impl<boost::unit_test::lazy_ostream,_boost::unit_test::basic_cstring<const_char>,_const_boost::unit_test::basic_cstring<const_char>_&>
    ::~lazy_ostream_impl
              ((lazy_ostream_impl<boost::unit_test::lazy_ostream,_boost::unit_test::basic_cstring<const_char>,_const_boost::unit_test::basic_cstring<const_char>_&>
                *)in_stack_ffffffffffffd508);
    boost::test_tools::assertion_result::~assertion_result
              ((assertion_result *)in_stack_ffffffffffffd508);
    bVar2 = boost::test_tools::tt_detail::dummy_cond();
  } while (bVar2);
  std::vector<CTxIn,_std::allocator<CTxIn>_>::operator[]
            (&in_stack_ffffffffffffd518->vin,
             CONCAT17(in_stack_ffffffffffffd517,in_stack_ffffffffffffd510));
  std::shared_ptr<const_CTransaction>::shared_ptr
            ((shared_ptr<const_CTransaction> *)in_stack_ffffffffffffd508,
             (shared_ptr<const_CTransaction> *)0xb3a147);
  CombineSignatures((CMutableTransaction *)
                    CONCAT17(in_stack_ffffffffffffd587,in_stack_ffffffffffffd580),
                    in_stack_ffffffffffffd578,(CTransactionRef *)in_stack_ffffffffffffd570);
  UpdateInput((CTxIn *)in_stack_ffffffffffffd508,(SignatureData *)0xb3a183);
  SignatureData::~SignatureData(in_stack_ffffffffffffd508);
  std::shared_ptr<const_CTransaction>::~shared_ptr
            ((shared_ptr<const_CTransaction> *)in_stack_ffffffffffffd508);
  CheckWithFlag((CTransactionRef *)in_stack_ffffffffffffd568,in_stack_ffffffffffffd560,
                (uint32_t)((ulong)in_stack_ffffffffffffd558 >> 0x20),
                SUB81((ulong)in_stack_ffffffffffffd558 >> 0x18,0));
  ScriptHash::ScriptHash(in_stack_ffffffffffffd520,(CScript *)in_stack_ffffffffffffd518);
  std::
  variant<CNoDestination,PubKeyDestination,PKHash,ScriptHash,WitnessV0ScriptHash,WitnessV0KeyHash,WitnessV1Taproot,PayToAnchor,WitnessUnknown>
  ::variant<ScriptHash,void,void,ScriptHash,void>
            ((variant<CNoDestination,_PubKeyDestination,_PKHash,_ScriptHash,_WitnessV0ScriptHash,_WitnessV0KeyHash,_WitnessV1Taproot,_PayToAnchor,_WitnessUnknown>
              *)in_stack_ffffffffffffd518,
             (ScriptHash *)CONCAT17(in_stack_ffffffffffffd517,in_stack_ffffffffffffd510));
  GetScriptForDestination((CTxDestination *)in_stack_ffffffffffffd508);
  CreateCreditAndSpend(keystore_00,outscript,output_00,input_00,SUB81((ulong)puVar4 >> 0x38,0));
  CScript::~CScript((CScript *)in_stack_ffffffffffffd508);
  std::
  variant<CNoDestination,_PubKeyDestination,_PKHash,_ScriptHash,_WitnessV0ScriptHash,_WitnessV0KeyHash,_WitnessV1Taproot,_PayToAnchor,_WitnessUnknown>
  ::~variant((variant<CNoDestination,_PubKeyDestination,_PKHash,_ScriptHash,_WitnessV0ScriptHash,_WitnessV0KeyHash,_WitnessV1Taproot,_PayToAnchor,_WitnessUnknown>
              *)in_stack_ffffffffffffd508);
  CheckWithFlag((CTransactionRef *)in_stack_ffffffffffffd568,in_stack_ffffffffffffd560,
                (uint32_t)((ulong)in_stack_ffffffffffffd558 >> 0x20),
                SUB81((ulong)in_stack_ffffffffffffd558 >> 0x18,0));
  CheckWithFlag((CTransactionRef *)in_stack_ffffffffffffd568,in_stack_ffffffffffffd560,
                (uint32_t)((ulong)in_stack_ffffffffffffd558 >> 0x20),
                SUB81((ulong)in_stack_ffffffffffffd558 >> 0x18,0));
  ScriptHash::ScriptHash(in_stack_ffffffffffffd520,(CScript *)in_stack_ffffffffffffd518);
  std::
  variant<CNoDestination,PubKeyDestination,PKHash,ScriptHash,WitnessV0ScriptHash,WitnessV0KeyHash,WitnessV1Taproot,PayToAnchor,WitnessUnknown>
  ::variant<ScriptHash,void,void,ScriptHash,void>
            ((variant<CNoDestination,_PubKeyDestination,_PKHash,_ScriptHash,_WitnessV0ScriptHash,_WitnessV0KeyHash,_WitnessV1Taproot,_PayToAnchor,_WitnessUnknown>
              *)in_stack_ffffffffffffd518,
             (ScriptHash *)CONCAT17(in_stack_ffffffffffffd517,in_stack_ffffffffffffd510));
  GetScriptForDestination((CTxDestination *)in_stack_ffffffffffffd508);
  CreateCreditAndSpend(keystore_00,outscript,output_00,input_00,SUB81((ulong)puVar4 >> 0x38,0));
  CScript::~CScript((CScript *)in_stack_ffffffffffffd508);
  std::
  variant<CNoDestination,_PubKeyDestination,_PKHash,_ScriptHash,_WitnessV0ScriptHash,_WitnessV0KeyHash,_WitnessV1Taproot,_PayToAnchor,_WitnessUnknown>
  ::~variant((variant<CNoDestination,_PubKeyDestination,_PKHash,_ScriptHash,_WitnessV0ScriptHash,_WitnessV0KeyHash,_WitnessV1Taproot,_PayToAnchor,_WitnessUnknown>
              *)in_stack_ffffffffffffd508);
  CheckWithFlag((CTransactionRef *)in_stack_ffffffffffffd568,in_stack_ffffffffffffd560,
                (uint32_t)((ulong)in_stack_ffffffffffffd558 >> 0x20),
                SUB81((ulong)in_stack_ffffffffffffd558 >> 0x18,0));
  CheckWithFlag((CTransactionRef *)in_stack_ffffffffffffd568,in_stack_ffffffffffffd560,
                (uint32_t)((ulong)in_stack_ffffffffffffd558 >> 0x20),
                SUB81((ulong)in_stack_ffffffffffffd558 >> 0x18,0));
  do {
    boost::unit_test::basic_cstring<const_char>::basic_cstring<unsigned_long>
              ((basic_cstring<const_char> *)in_stack_ffffffffffffd518,
               (pointer)CONCAT17(in_stack_ffffffffffffd517,in_stack_ffffffffffffd510),
               (unsigned_long)in_stack_ffffffffffffd508);
    boost::unit_test::basic_cstring<const_char>::basic_cstring
              ((basic_cstring<const_char> *)in_stack_ffffffffffffd508);
    boost::unit_test::unit_test_log_t::set_checkpoint
              ((unit_test_log_t *)CONCAT17(in_stack_ffffffffffffd54f,in_stack_ffffffffffffd548),
               (const_string *)in_stack_ffffffffffffd540,(size_t)in_stack_ffffffffffffd538,
               (const_string *)CONCAT17(in_stack_ffffffffffffd537,in_stack_ffffffffffffd530));
    std::__shared_ptr_access<const_CTransaction,_(__gnu_cxx::_Lock_policy)2,_false,_false>::
    operator*((__shared_ptr_access<const_CTransaction,_(__gnu_cxx::_Lock_policy)2,_false,_false> *)
              in_stack_ffffffffffffd518);
    std::__shared_ptr_access<const_CTransaction,_(__gnu_cxx::_Lock_policy)2,_false,_false>::
    operator*((__shared_ptr_access<const_CTransaction,_(__gnu_cxx::_Lock_policy)2,_false,_false> *)
              in_stack_ffffffffffffd518);
    ::operator==(in_stack_ffffffffffffd518,
                 (CTransaction *)CONCAT17(in_stack_ffffffffffffd517,in_stack_ffffffffffffd510));
    boost::test_tools::assertion_result::assertion_result
              ((assertion_result *)in_stack_ffffffffffffd518,(bool)in_stack_ffffffffffffd517);
    boost::unit_test::lazy_ostream::instance();
    boost::unit_test::basic_cstring<const_char>::basic_cstring<unsigned_long>
              ((basic_cstring<const_char> *)in_stack_ffffffffffffd518,
               (pointer)CONCAT17(in_stack_ffffffffffffd517,in_stack_ffffffffffffd510),
               (unsigned_long)in_stack_ffffffffffffd508);
    boost::unit_test::operator<<
              ((lazy_ostream *)CONCAT17(in_stack_ffffffffffffd517,in_stack_ffffffffffffd510),
               (basic_cstring<const_char> *)in_stack_ffffffffffffd508);
    boost::unit_test::basic_cstring<const_char>::basic_cstring<unsigned_long>
              ((basic_cstring<const_char> *)in_stack_ffffffffffffd518,
               (pointer)CONCAT17(in_stack_ffffffffffffd517,in_stack_ffffffffffffd510),
               (unsigned_long)in_stack_ffffffffffffd508);
    in_stack_ffffffffffffd508 = (SignatureData *)0x0;
    boost::test_tools::tt_detail::report_assertion
              (local_2570,local_2590,local_25b0,0x2f0,CHECK,CHECK_PRED);
    boost::unit_test::
    lazy_ostream_impl<boost::unit_test::lazy_ostream,_boost::unit_test::basic_cstring<const_char>,_const_boost::unit_test::basic_cstring<const_char>_&>
    ::~lazy_ostream_impl
              ((lazy_ostream_impl<boost::unit_test::lazy_ostream,_boost::unit_test::basic_cstring<const_char>,_const_boost::unit_test::basic_cstring<const_char>_&>
                *)in_stack_ffffffffffffd508);
    boost::test_tools::assertion_result::~assertion_result
              ((assertion_result *)in_stack_ffffffffffffd508);
    bVar2 = boost::test_tools::tt_detail::dummy_cond();
  } while (bVar2);
  std::vector<CTxIn,_std::allocator<CTxIn>_>::operator[]
            (&in_stack_ffffffffffffd518->vin,
             CONCAT17(in_stack_ffffffffffffd517,in_stack_ffffffffffffd510));
  std::shared_ptr<const_CTransaction>::shared_ptr
            ((shared_ptr<const_CTransaction> *)in_stack_ffffffffffffd508,
             (shared_ptr<const_CTransaction> *)0xb3a521);
  CombineSignatures((CMutableTransaction *)
                    CONCAT17(in_stack_ffffffffffffd587,in_stack_ffffffffffffd580),
                    in_stack_ffffffffffffd578,(CTransactionRef *)in_stack_ffffffffffffd570);
  UpdateInput((CTxIn *)in_stack_ffffffffffffd508,(SignatureData *)0xb3a55d);
  SignatureData::~SignatureData(in_stack_ffffffffffffd508);
  std::shared_ptr<const_CTransaction>::~shared_ptr
            ((shared_ptr<const_CTransaction> *)in_stack_ffffffffffffd508);
  CheckWithFlag((CTransactionRef *)in_stack_ffffffffffffd568,in_stack_ffffffffffffd560,
                (uint32_t)((ulong)in_stack_ffffffffffffd558 >> 0x20),
                SUB81((ulong)in_stack_ffffffffffffd558 >> 0x18,0));
  CheckWithFlag((CTransactionRef *)in_stack_ffffffffffffd568,in_stack_ffffffffffffd560,
                (uint32_t)((ulong)in_stack_ffffffffffffd558 >> 0x20),
                SUB81((ulong)in_stack_ffffffffffffd558 >> 0x18,0));
  CreateCreditAndSpend(keystore_00,outscript,output_00,input_00,SUB81((ulong)puVar4 >> 0x38,0));
  CheckWithFlag((CTransactionRef *)in_stack_ffffffffffffd568,in_stack_ffffffffffffd560,
                (uint32_t)((ulong)in_stack_ffffffffffffd558 >> 0x20),
                SUB81((ulong)in_stack_ffffffffffffd558 >> 0x18,0));
  CheckWithFlag((CTransactionRef *)in_stack_ffffffffffffd568,in_stack_ffffffffffffd560,
                (uint32_t)((ulong)in_stack_ffffffffffffd558 >> 0x20),
                SUB81((ulong)in_stack_ffffffffffffd558 >> 0x18,0));
  CreateCreditAndSpend(keystore_00,outscript,output_00,input_00,SUB81((ulong)puVar4 >> 0x38,0));
  CheckWithFlag((CTransactionRef *)in_stack_ffffffffffffd568,in_stack_ffffffffffffd560,
                (uint32_t)((ulong)in_stack_ffffffffffffd558 >> 0x20),
                SUB81((ulong)in_stack_ffffffffffffd558 >> 0x18,0));
  CheckWithFlag((CTransactionRef *)in_stack_ffffffffffffd568,in_stack_ffffffffffffd560,
                (uint32_t)((ulong)in_stack_ffffffffffffd558 >> 0x20),
                SUB81((ulong)in_stack_ffffffffffffd558 >> 0x18,0));
  do {
    boost::unit_test::basic_cstring<const_char>::basic_cstring<unsigned_long>
              ((basic_cstring<const_char> *)in_stack_ffffffffffffd518,
               (pointer)CONCAT17(in_stack_ffffffffffffd517,in_stack_ffffffffffffd510),
               (unsigned_long)in_stack_ffffffffffffd508);
    boost::unit_test::basic_cstring<const_char>::basic_cstring
              ((basic_cstring<const_char> *)in_stack_ffffffffffffd508);
    boost::unit_test::unit_test_log_t::set_checkpoint
              ((unit_test_log_t *)CONCAT17(in_stack_ffffffffffffd54f,in_stack_ffffffffffffd548),
               (const_string *)in_stack_ffffffffffffd540,(size_t)in_stack_ffffffffffffd538,
               (const_string *)CONCAT17(in_stack_ffffffffffffd537,in_stack_ffffffffffffd530));
    std::__shared_ptr_access<const_CTransaction,_(__gnu_cxx::_Lock_policy)2,_false,_false>::
    operator*((__shared_ptr_access<const_CTransaction,_(__gnu_cxx::_Lock_policy)2,_false,_false> *)
              in_stack_ffffffffffffd518);
    std::__shared_ptr_access<const_CTransaction,_(__gnu_cxx::_Lock_policy)2,_false,_false>::
    operator*((__shared_ptr_access<const_CTransaction,_(__gnu_cxx::_Lock_policy)2,_false,_false> *)
              in_stack_ffffffffffffd518);
    ::operator==(in_stack_ffffffffffffd518,
                 (CTransaction *)CONCAT17(in_stack_ffffffffffffd517,in_stack_ffffffffffffd510));
    boost::test_tools::assertion_result::assertion_result
              ((assertion_result *)in_stack_ffffffffffffd518,(bool)in_stack_ffffffffffffd517);
    boost::unit_test::lazy_ostream::instance();
    boost::unit_test::basic_cstring<const_char>::basic_cstring<unsigned_long>
              ((basic_cstring<const_char> *)in_stack_ffffffffffffd518,
               (pointer)CONCAT17(in_stack_ffffffffffffd517,in_stack_ffffffffffffd510),
               (unsigned_long)in_stack_ffffffffffffd508);
    boost::unit_test::operator<<
              ((lazy_ostream *)CONCAT17(in_stack_ffffffffffffd517,in_stack_ffffffffffffd510),
               (basic_cstring<const_char> *)in_stack_ffffffffffffd508);
    boost::unit_test::basic_cstring<const_char>::basic_cstring<unsigned_long>
              ((basic_cstring<const_char> *)in_stack_ffffffffffffd518,
               (pointer)CONCAT17(in_stack_ffffffffffffd517,in_stack_ffffffffffffd510),
               (unsigned_long)in_stack_ffffffffffffd508);
    in_stack_ffffffffffffd508 = (SignatureData *)0x0;
    boost::test_tools::tt_detail::report_assertion
              (local_25f8,local_2618,(const_string *)(local_2648 + 0x10),0x2fc,CHECK,CHECK_PRED);
    boost::unit_test::
    lazy_ostream_impl<boost::unit_test::lazy_ostream,_boost::unit_test::basic_cstring<const_char>,_const_boost::unit_test::basic_cstring<const_char>_&>
    ::~lazy_ostream_impl
              ((lazy_ostream_impl<boost::unit_test::lazy_ostream,_boost::unit_test::basic_cstring<const_char>,_const_boost::unit_test::basic_cstring<const_char>_&>
                *)in_stack_ffffffffffffd508);
    boost::test_tools::assertion_result::~assertion_result
              ((assertion_result *)in_stack_ffffffffffffd508);
    uVar3 = boost::test_tools::tt_detail::dummy_cond();
    success = (undefined1)((ulong)puVar4 >> 0x38);
  } while ((bool)uVar3);
  tx = &input1;
  output = std::vector<CTxIn,_std::allocator<CTxIn>_>::operator[]
                     (&in_stack_ffffffffffffd518->vin,
                      CONCAT17(in_stack_ffffffffffffd517,in_stack_ffffffffffffd510));
  input2_00 = (CMutableTransaction *)local_2648;
  std::shared_ptr<const_CTransaction>::shared_ptr
            ((shared_ptr<const_CTransaction> *)in_stack_ffffffffffffd508,
             (shared_ptr<const_CTransaction> *)0xb3a840);
  CombineSignatures((CMutableTransaction *)CONCAT17(uVar3,in_stack_ffffffffffffd580),input2_00,
                    (CTransactionRef *)tx);
  UpdateInput((CTxIn *)in_stack_ffffffffffffd508,(SignatureData *)0xb3a873);
  SignatureData::~SignatureData(in_stack_ffffffffffffd508);
  std::shared_ptr<const_CTransaction>::~shared_ptr
            ((shared_ptr<const_CTransaction> *)in_stack_ffffffffffffd508);
  CheckWithFlag((CTransactionRef *)output,in_stack_ffffffffffffd560,
                (uint32_t)((ulong)in_stack_ffffffffffffd558 >> 0x20),
                SUB81((ulong)in_stack_ffffffffffffd558 >> 0x18,0));
  CheckWithFlag((CTransactionRef *)output,in_stack_ffffffffffffd560,
                (uint32_t)((ulong)in_stack_ffffffffffffd558 >> 0x20),
                SUB81((ulong)in_stack_ffffffffffffd558 >> 0x18,0));
  ScriptHash::ScriptHash(in_stack_ffffffffffffd520,(CScript *)in_stack_ffffffffffffd518);
  input = local_16f0;
  std::
  variant<CNoDestination,PubKeyDestination,PKHash,ScriptHash,WitnessV0ScriptHash,WitnessV0KeyHash,WitnessV1Taproot,PayToAnchor,WitnessUnknown>
  ::variant<ScriptHash,void,void,ScriptHash,void>
            ((variant<CNoDestination,_PubKeyDestination,_PKHash,_ScriptHash,_WitnessV0ScriptHash,_WitnessV0KeyHash,_WitnessV1Taproot,_PayToAnchor,_WitnessUnknown>
              *)in_stack_ffffffffffffd518,
             (ScriptHash *)CONCAT17(in_stack_ffffffffffffd517,in_stack_ffffffffffffd510));
  GetScriptForDestination((CTxDestination *)in_stack_ffffffffffffd508);
  CreateCreditAndSpend(keystore_00,outscript,output_00,input_00,(bool)success);
  CScript::~CScript((CScript *)in_stack_ffffffffffffd508);
  std::
  variant<CNoDestination,_PubKeyDestination,_PKHash,_ScriptHash,_WitnessV0ScriptHash,_WitnessV0KeyHash,_WitnessV1Taproot,_PayToAnchor,_WitnessUnknown>
  ::~variant((variant<CNoDestination,_PubKeyDestination,_PKHash,_ScriptHash,_WitnessV0ScriptHash,_WitnessV0KeyHash,_WitnessV1Taproot,_PayToAnchor,_WitnessUnknown>
              *)in_stack_ffffffffffffd508);
  CheckWithFlag((CTransactionRef *)output,input,(uint32_t)((ulong)in_stack_ffffffffffffd558 >> 0x20)
                ,SUB81((ulong)in_stack_ffffffffffffd558 >> 0x18,0));
  CheckWithFlag((CTransactionRef *)output,input,(uint32_t)((ulong)in_stack_ffffffffffffd558 >> 0x20)
                ,SUB81((ulong)in_stack_ffffffffffffd558 >> 0x18,0));
  ScriptHash::ScriptHash(in_stack_ffffffffffffd520,(CScript *)in_stack_ffffffffffffd518);
  puVar4 = local_1778;
  std::
  variant<CNoDestination,PubKeyDestination,PKHash,ScriptHash,WitnessV0ScriptHash,WitnessV0KeyHash,WitnessV1Taproot,PayToAnchor,WitnessUnknown>
  ::variant<ScriptHash,void,void,ScriptHash,void>
            ((variant<CNoDestination,_PubKeyDestination,_PKHash,_ScriptHash,_WitnessV0ScriptHash,_WitnessV0KeyHash,_WitnessV1Taproot,_PayToAnchor,_WitnessUnknown>
              *)in_stack_ffffffffffffd518,
             (ScriptHash *)CONCAT17(in_stack_ffffffffffffd517,in_stack_ffffffffffffd510));
  GetScriptForDestination((CTxDestination *)in_stack_ffffffffffffd508);
  CreateCreditAndSpend(keystore_00,outscript,output_00,input_00,(bool)success);
  CScript::~CScript((CScript *)in_stack_ffffffffffffd508);
  std::
  variant<CNoDestination,_PubKeyDestination,_PKHash,_ScriptHash,_WitnessV0ScriptHash,_WitnessV0KeyHash,_WitnessV1Taproot,_PayToAnchor,_WitnessUnknown>
  ::~variant((variant<CNoDestination,_PubKeyDestination,_PKHash,_ScriptHash,_WitnessV0ScriptHash,_WitnessV0KeyHash,_WitnessV1Taproot,_PayToAnchor,_WitnessUnknown>
              *)in_stack_ffffffffffffd508);
  CheckWithFlag((CTransactionRef *)output,input,(uint32_t)((ulong)puVar4 >> 0x20),
                SUB81((ulong)puVar4 >> 0x18,0));
  CheckWithFlag((CTransactionRef *)output,input,(uint32_t)((ulong)puVar4 >> 0x20),
                SUB81((ulong)puVar4 >> 0x18,0));
  do {
    boost::unit_test::basic_cstring<const_char>::basic_cstring<unsigned_long>
              ((basic_cstring<const_char> *)in_stack_ffffffffffffd518,
               (pointer)CONCAT17(in_stack_ffffffffffffd517,in_stack_ffffffffffffd510),
               (unsigned_long)in_stack_ffffffffffffd508);
    boost::unit_test::basic_cstring<const_char>::basic_cstring
              ((basic_cstring<const_char> *)in_stack_ffffffffffffd508);
    boost::unit_test::unit_test_log_t::set_checkpoint
              ((unit_test_log_t *)CONCAT17(in_stack_ffffffffffffd54f,in_stack_ffffffffffffd548),
               (const_string *)in_stack_ffffffffffffd540,(size_t)in_stack_ffffffffffffd538,
               (const_string *)CONCAT17(in_stack_ffffffffffffd537,in_stack_ffffffffffffd530));
    in_stack_ffffffffffffd540 =
         std::__shared_ptr_access<const_CTransaction,_(__gnu_cxx::_Lock_policy)2,_false,_false>::
         operator*((__shared_ptr_access<const_CTransaction,_(__gnu_cxx::_Lock_policy)2,_false,_false>
                    *)in_stack_ffffffffffffd518);
    std::__shared_ptr_access<const_CTransaction,_(__gnu_cxx::_Lock_policy)2,_false,_false>::
    operator*((__shared_ptr_access<const_CTransaction,_(__gnu_cxx::_Lock_policy)2,_false,_false> *)
              in_stack_ffffffffffffd518);
    in_stack_ffffffffffffd54f =
         ::operator==(in_stack_ffffffffffffd518,
                      (CTransaction *)CONCAT17(in_stack_ffffffffffffd517,in_stack_ffffffffffffd510))
    ;
    boost::test_tools::assertion_result::assertion_result
              ((assertion_result *)in_stack_ffffffffffffd518,(bool)in_stack_ffffffffffffd517);
    in_stack_ffffffffffffd538 = boost::unit_test::lazy_ostream::instance();
    boost::unit_test::basic_cstring<const_char>::basic_cstring<unsigned_long>
              ((basic_cstring<const_char> *)in_stack_ffffffffffffd518,
               (pointer)CONCAT17(in_stack_ffffffffffffd517,in_stack_ffffffffffffd510),
               (unsigned_long)in_stack_ffffffffffffd508);
    boost::unit_test::operator<<
              ((lazy_ostream *)CONCAT17(in_stack_ffffffffffffd517,in_stack_ffffffffffffd510),
               (basic_cstring<const_char> *)in_stack_ffffffffffffd508);
    boost::unit_test::basic_cstring<const_char>::basic_cstring<unsigned_long>
              ((basic_cstring<const_char> *)in_stack_ffffffffffffd518,
               (pointer)CONCAT17(in_stack_ffffffffffffd517,in_stack_ffffffffffffd510),
               (unsigned_long)in_stack_ffffffffffffd508);
    in_stack_ffffffffffffd508 = (SignatureData *)0x0;
    boost::test_tools::tt_detail::report_assertion
              (local_2680,local_26a0,local_26c0,0x308,CHECK,CHECK_PRED);
    boost::unit_test::
    lazy_ostream_impl<boost::unit_test::lazy_ostream,_boost::unit_test::basic_cstring<const_char>,_const_boost::unit_test::basic_cstring<const_char>_&>
    ::~lazy_ostream_impl
              ((lazy_ostream_impl<boost::unit_test::lazy_ostream,_boost::unit_test::basic_cstring<const_char>,_const_boost::unit_test::basic_cstring<const_char>_&>
                *)in_stack_ffffffffffffd508);
    boost::test_tools::assertion_result::~assertion_result
              ((assertion_result *)in_stack_ffffffffffffd508);
    in_stack_ffffffffffffd537 = boost::test_tools::tt_detail::dummy_cond();
  } while ((bool)in_stack_ffffffffffffd537);
  this_00 = std::vector<CTxIn,_std::allocator<CTxIn>_>::operator[]
                      (&in_stack_ffffffffffffd518->vin,
                       CONCAT17(in_stack_ffffffffffffd517,in_stack_ffffffffffffd510));
  std::shared_ptr<const_CTransaction>::shared_ptr
            ((shared_ptr<const_CTransaction> *)in_stack_ffffffffffffd508,
             (shared_ptr<const_CTransaction> *)0xb3abff);
  CombineSignatures((CMutableTransaction *)CONCAT17(uVar3,in_stack_ffffffffffffd580),input2_00,
                    (CTransactionRef *)tx);
  UpdateInput((CTxIn *)in_stack_ffffffffffffd508,(SignatureData *)0xb3ac32);
  SignatureData::~SignatureData(in_stack_ffffffffffffd508);
  std::shared_ptr<const_CTransaction>::~shared_ptr
            ((shared_ptr<const_CTransaction> *)in_stack_ffffffffffffd508);
  CheckWithFlag((CTransactionRef *)output,input,(uint32_t)((ulong)puVar4 >> 0x20),
                SUB81((ulong)puVar4 >> 0x18,0));
  CheckWithFlag((CTransactionRef *)output,input,(uint32_t)((ulong)puVar4 >> 0x20),
                SUB81((ulong)puVar4 >> 0x18,0));
  CMutableTransaction::~CMutableTransaction((CMutableTransaction *)in_stack_ffffffffffffd508);
  CMutableTransaction::~CMutableTransaction((CMutableTransaction *)in_stack_ffffffffffffd508);
  std::shared_ptr<const_CTransaction>::~shared_ptr
            ((shared_ptr<const_CTransaction> *)in_stack_ffffffffffffd508);
  std::shared_ptr<const_CTransaction>::~shared_ptr
            ((shared_ptr<const_CTransaction> *)in_stack_ffffffffffffd508);
  CScript::~CScript((CScript *)in_stack_ffffffffffffd508);
  CScript::~CScript((CScript *)in_stack_ffffffffffffd508);
  CScript::~CScript((CScript *)in_stack_ffffffffffffd508);
  CScript::~CScript((CScript *)in_stack_ffffffffffffd508);
  CScript::~CScript((CScript *)in_stack_ffffffffffffd508);
  std::vector<CPubKey,_std::allocator<CPubKey>_>::~vector
            ((vector<CPubKey,_std::allocator<CPubKey>_> *)this_00);
  CScript::~CScript((CScript *)in_stack_ffffffffffffd508);
  CScript::~CScript((CScript *)in_stack_ffffffffffffd508);
  CScript::~CScript((CScript *)in_stack_ffffffffffffd508);
  CScript::~CScript((CScript *)in_stack_ffffffffffffd508);
  CScript::~CScript((CScript *)in_stack_ffffffffffffd508);
  CKey::~CKey((CKey *)in_stack_ffffffffffffd508);
  CKey::~CKey((CKey *)in_stack_ffffffffffffd508);
  CKey::~CKey((CKey *)in_stack_ffffffffffffd508);
  CKey::~CKey((CKey *)in_stack_ffffffffffffd508);
  CKey::~CKey((CKey *)in_stack_ffffffffffffd508);
  FillableSigningProvider::~FillableSigningProvider
            ((FillableSigningProvider *)in_stack_ffffffffffffd508);
  FillableSigningProvider::~FillableSigningProvider
            ((FillableSigningProvider *)in_stack_ffffffffffffd508);
  if (*(long *)(in_FS_OFFSET + 0x28) != lVar1) {
    __stack_chk_fail();
  }
  return;
}

Assistant:

BOOST_AUTO_TEST_CASE(test_witness)
{
    FillableSigningProvider keystore, keystore2;
    CKey key1 = GenerateRandomKey();
    CKey key2 = GenerateRandomKey();
    CKey key3 = GenerateRandomKey();
    CKey key1L = GenerateRandomKey(/*compressed=*/false);
    CKey key2L = GenerateRandomKey(/*compressed=*/false);
    CPubKey pubkey1 = key1.GetPubKey();
    CPubKey pubkey2 = key2.GetPubKey();
    CPubKey pubkey3 = key3.GetPubKey();
    CPubKey pubkey1L = key1L.GetPubKey();
    CPubKey pubkey2L = key2L.GetPubKey();
    BOOST_CHECK(keystore.AddKeyPubKey(key1, pubkey1));
    BOOST_CHECK(keystore.AddKeyPubKey(key2, pubkey2));
    BOOST_CHECK(keystore.AddKeyPubKey(key1L, pubkey1L));
    BOOST_CHECK(keystore.AddKeyPubKey(key2L, pubkey2L));
    CScript scriptPubkey1, scriptPubkey2, scriptPubkey1L, scriptPubkey2L, scriptMulti;
    scriptPubkey1 << ToByteVector(pubkey1) << OP_CHECKSIG;
    scriptPubkey2 << ToByteVector(pubkey2) << OP_CHECKSIG;
    scriptPubkey1L << ToByteVector(pubkey1L) << OP_CHECKSIG;
    scriptPubkey2L << ToByteVector(pubkey2L) << OP_CHECKSIG;
    std::vector<CPubKey> oneandthree;
    oneandthree.push_back(pubkey1);
    oneandthree.push_back(pubkey3);
    scriptMulti = GetScriptForMultisig(2, oneandthree);
    BOOST_CHECK(keystore.AddCScript(scriptPubkey1));
    BOOST_CHECK(keystore.AddCScript(scriptPubkey2));
    BOOST_CHECK(keystore.AddCScript(scriptPubkey1L));
    BOOST_CHECK(keystore.AddCScript(scriptPubkey2L));
    BOOST_CHECK(keystore.AddCScript(scriptMulti));
    CScript destination_script_1, destination_script_2, destination_script_1L, destination_script_2L, destination_script_multi;
    destination_script_1 = GetScriptForDestination(WitnessV0KeyHash(pubkey1));
    destination_script_2 = GetScriptForDestination(WitnessV0KeyHash(pubkey2));
    destination_script_1L = GetScriptForDestination(WitnessV0KeyHash(pubkey1L));
    destination_script_2L = GetScriptForDestination(WitnessV0KeyHash(pubkey2L));
    destination_script_multi = GetScriptForDestination(WitnessV0ScriptHash(scriptMulti));
    BOOST_CHECK(keystore.AddCScript(destination_script_1));
    BOOST_CHECK(keystore.AddCScript(destination_script_2));
    BOOST_CHECK(keystore.AddCScript(destination_script_1L));
    BOOST_CHECK(keystore.AddCScript(destination_script_2L));
    BOOST_CHECK(keystore.AddCScript(destination_script_multi));
    BOOST_CHECK(keystore2.AddCScript(scriptMulti));
    BOOST_CHECK(keystore2.AddCScript(destination_script_multi));
    BOOST_CHECK(keystore2.AddKeyPubKey(key3, pubkey3));

    CTransactionRef output1, output2;
    CMutableTransaction input1, input2;

    // Normal pay-to-compressed-pubkey.
    CreateCreditAndSpend(keystore, scriptPubkey1, output1, input1);
    CreateCreditAndSpend(keystore, scriptPubkey2, output2, input2);
    CheckWithFlag(output1, input1, SCRIPT_VERIFY_NONE, true);
    CheckWithFlag(output1, input1, SCRIPT_VERIFY_P2SH, true);
    CheckWithFlag(output1, input1, SCRIPT_VERIFY_WITNESS | SCRIPT_VERIFY_P2SH, true);
    CheckWithFlag(output1, input1, STANDARD_SCRIPT_VERIFY_FLAGS, true);
    CheckWithFlag(output1, input2, SCRIPT_VERIFY_NONE, false);
    CheckWithFlag(output1, input2, SCRIPT_VERIFY_P2SH, false);
    CheckWithFlag(output1, input2, SCRIPT_VERIFY_WITNESS | SCRIPT_VERIFY_P2SH, false);
    CheckWithFlag(output1, input2, STANDARD_SCRIPT_VERIFY_FLAGS, false);

    // P2SH pay-to-compressed-pubkey.
    CreateCreditAndSpend(keystore, GetScriptForDestination(ScriptHash(scriptPubkey1)), output1, input1);
    CreateCreditAndSpend(keystore, GetScriptForDestination(ScriptHash(scriptPubkey2)), output2, input2);
    ReplaceRedeemScript(input2.vin[0].scriptSig, scriptPubkey1);
    CheckWithFlag(output1, input1, SCRIPT_VERIFY_NONE, true);
    CheckWithFlag(output1, input1, SCRIPT_VERIFY_P2SH, true);
    CheckWithFlag(output1, input1, SCRIPT_VERIFY_WITNESS | SCRIPT_VERIFY_P2SH, true);
    CheckWithFlag(output1, input1, STANDARD_SCRIPT_VERIFY_FLAGS, true);
    CheckWithFlag(output1, input2, SCRIPT_VERIFY_NONE, true);
    CheckWithFlag(output1, input2, SCRIPT_VERIFY_P2SH, false);
    CheckWithFlag(output1, input2, SCRIPT_VERIFY_WITNESS | SCRIPT_VERIFY_P2SH, false);
    CheckWithFlag(output1, input2, STANDARD_SCRIPT_VERIFY_FLAGS, false);

    // Witness pay-to-compressed-pubkey (v0).
    CreateCreditAndSpend(keystore, destination_script_1, output1, input1);
    CreateCreditAndSpend(keystore, destination_script_2, output2, input2);
    CheckWithFlag(output1, input1, SCRIPT_VERIFY_NONE, true);
    CheckWithFlag(output1, input1, SCRIPT_VERIFY_P2SH, true);
    CheckWithFlag(output1, input1, SCRIPT_VERIFY_WITNESS | SCRIPT_VERIFY_P2SH, true);
    CheckWithFlag(output1, input1, STANDARD_SCRIPT_VERIFY_FLAGS, true);
    CheckWithFlag(output1, input2, SCRIPT_VERIFY_NONE, true);
    CheckWithFlag(output1, input2, SCRIPT_VERIFY_P2SH, true);
    CheckWithFlag(output1, input2, SCRIPT_VERIFY_WITNESS | SCRIPT_VERIFY_P2SH, false);
    CheckWithFlag(output1, input2, STANDARD_SCRIPT_VERIFY_FLAGS, false);

    // P2SH witness pay-to-compressed-pubkey (v0).
    CreateCreditAndSpend(keystore, GetScriptForDestination(ScriptHash(destination_script_1)), output1, input1);
    CreateCreditAndSpend(keystore, GetScriptForDestination(ScriptHash(destination_script_2)), output2, input2);
    ReplaceRedeemScript(input2.vin[0].scriptSig, destination_script_1);
    CheckWithFlag(output1, input1, SCRIPT_VERIFY_NONE, true);
    CheckWithFlag(output1, input1, SCRIPT_VERIFY_P2SH, true);
    CheckWithFlag(output1, input1, SCRIPT_VERIFY_WITNESS | SCRIPT_VERIFY_P2SH, true);
    CheckWithFlag(output1, input1, STANDARD_SCRIPT_VERIFY_FLAGS, true);
    CheckWithFlag(output1, input2, SCRIPT_VERIFY_NONE, true);
    CheckWithFlag(output1, input2, SCRIPT_VERIFY_P2SH, true);
    CheckWithFlag(output1, input2, SCRIPT_VERIFY_WITNESS | SCRIPT_VERIFY_P2SH, false);
    CheckWithFlag(output1, input2, STANDARD_SCRIPT_VERIFY_FLAGS, false);

    // Normal pay-to-uncompressed-pubkey.
    CreateCreditAndSpend(keystore, scriptPubkey1L, output1, input1);
    CreateCreditAndSpend(keystore, scriptPubkey2L, output2, input2);
    CheckWithFlag(output1, input1, SCRIPT_VERIFY_NONE, true);
    CheckWithFlag(output1, input1, SCRIPT_VERIFY_P2SH, true);
    CheckWithFlag(output1, input1, SCRIPT_VERIFY_WITNESS | SCRIPT_VERIFY_P2SH, true);
    CheckWithFlag(output1, input1, STANDARD_SCRIPT_VERIFY_FLAGS, true);
    CheckWithFlag(output1, input2, SCRIPT_VERIFY_NONE, false);
    CheckWithFlag(output1, input2, SCRIPT_VERIFY_P2SH, false);
    CheckWithFlag(output1, input2, SCRIPT_VERIFY_WITNESS | SCRIPT_VERIFY_P2SH, false);
    CheckWithFlag(output1, input2, STANDARD_SCRIPT_VERIFY_FLAGS, false);

    // P2SH pay-to-uncompressed-pubkey.
    CreateCreditAndSpend(keystore, GetScriptForDestination(ScriptHash(scriptPubkey1L)), output1, input1);
    CreateCreditAndSpend(keystore, GetScriptForDestination(ScriptHash(scriptPubkey2L)), output2, input2);
    ReplaceRedeemScript(input2.vin[0].scriptSig, scriptPubkey1L);
    CheckWithFlag(output1, input1, SCRIPT_VERIFY_NONE, true);
    CheckWithFlag(output1, input1, SCRIPT_VERIFY_P2SH, true);
    CheckWithFlag(output1, input1, SCRIPT_VERIFY_WITNESS | SCRIPT_VERIFY_P2SH, true);
    CheckWithFlag(output1, input1, STANDARD_SCRIPT_VERIFY_FLAGS, true);
    CheckWithFlag(output1, input2, SCRIPT_VERIFY_NONE, true);
    CheckWithFlag(output1, input2, SCRIPT_VERIFY_P2SH, false);
    CheckWithFlag(output1, input2, SCRIPT_VERIFY_WITNESS | SCRIPT_VERIFY_P2SH, false);
    CheckWithFlag(output1, input2, STANDARD_SCRIPT_VERIFY_FLAGS, false);

    // Signing disabled for witness pay-to-uncompressed-pubkey (v1).
    CreateCreditAndSpend(keystore, destination_script_1L, output1, input1, false);
    CreateCreditAndSpend(keystore, destination_script_2L, output2, input2, false);

    // Signing disabled for P2SH witness pay-to-uncompressed-pubkey (v1).
    CreateCreditAndSpend(keystore, GetScriptForDestination(ScriptHash(destination_script_1L)), output1, input1, false);
    CreateCreditAndSpend(keystore, GetScriptForDestination(ScriptHash(destination_script_2L)), output2, input2, false);

    // Normal 2-of-2 multisig
    CreateCreditAndSpend(keystore, scriptMulti, output1, input1, false);
    CheckWithFlag(output1, input1, SCRIPT_VERIFY_NONE, false);
    CreateCreditAndSpend(keystore2, scriptMulti, output2, input2, false);
    CheckWithFlag(output2, input2, SCRIPT_VERIFY_NONE, false);
    BOOST_CHECK(*output1 == *output2);
    UpdateInput(input1.vin[0], CombineSignatures(input1, input2, output1));
    CheckWithFlag(output1, input1, STANDARD_SCRIPT_VERIFY_FLAGS, true);

    // P2SH 2-of-2 multisig
    CreateCreditAndSpend(keystore, GetScriptForDestination(ScriptHash(scriptMulti)), output1, input1, false);
    CheckWithFlag(output1, input1, SCRIPT_VERIFY_NONE, true);
    CheckWithFlag(output1, input1, SCRIPT_VERIFY_P2SH, false);
    CreateCreditAndSpend(keystore2, GetScriptForDestination(ScriptHash(scriptMulti)), output2, input2, false);
    CheckWithFlag(output2, input2, SCRIPT_VERIFY_NONE, true);
    CheckWithFlag(output2, input2, SCRIPT_VERIFY_P2SH, false);
    BOOST_CHECK(*output1 == *output2);
    UpdateInput(input1.vin[0], CombineSignatures(input1, input2, output1));
    CheckWithFlag(output1, input1, SCRIPT_VERIFY_P2SH, true);
    CheckWithFlag(output1, input1, STANDARD_SCRIPT_VERIFY_FLAGS, true);

    // Witness 2-of-2 multisig
    CreateCreditAndSpend(keystore, destination_script_multi, output1, input1, false);
    CheckWithFlag(output1, input1, SCRIPT_VERIFY_NONE, true);
    CheckWithFlag(output1, input1, SCRIPT_VERIFY_P2SH | SCRIPT_VERIFY_WITNESS, false);
    CreateCreditAndSpend(keystore2, destination_script_multi, output2, input2, false);
    CheckWithFlag(output2, input2, SCRIPT_VERIFY_NONE, true);
    CheckWithFlag(output2, input2, SCRIPT_VERIFY_P2SH | SCRIPT_VERIFY_WITNESS, false);
    BOOST_CHECK(*output1 == *output2);
    UpdateInput(input1.vin[0], CombineSignatures(input1, input2, output1));
    CheckWithFlag(output1, input1, SCRIPT_VERIFY_P2SH | SCRIPT_VERIFY_WITNESS, true);
    CheckWithFlag(output1, input1, STANDARD_SCRIPT_VERIFY_FLAGS, true);

    // P2SH witness 2-of-2 multisig
    CreateCreditAndSpend(keystore, GetScriptForDestination(ScriptHash(destination_script_multi)), output1, input1, false);
    CheckWithFlag(output1, input1, SCRIPT_VERIFY_P2SH, true);
    CheckWithFlag(output1, input1, SCRIPT_VERIFY_P2SH | SCRIPT_VERIFY_WITNESS, false);
    CreateCreditAndSpend(keystore2, GetScriptForDestination(ScriptHash(destination_script_multi)), output2, input2, false);
    CheckWithFlag(output2, input2, SCRIPT_VERIFY_P2SH, true);
    CheckWithFlag(output2, input2, SCRIPT_VERIFY_P2SH | SCRIPT_VERIFY_WITNESS, false);
    BOOST_CHECK(*output1 == *output2);
    UpdateInput(input1.vin[0], CombineSignatures(input1, input2, output1));
    CheckWithFlag(output1, input1, SCRIPT_VERIFY_P2SH | SCRIPT_VERIFY_WITNESS, true);
    CheckWithFlag(output1, input1, STANDARD_SCRIPT_VERIFY_FLAGS, true);
}